

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  bool bVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  float fVar92;
  undefined4 uVar93;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar101;
  float t1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  vfloat4 a0_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  vfloat4 b0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vfloat4 a0_3;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  __m128 a_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  __m128 a;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar195;
  float fVar197;
  vfloat4 a0_1;
  float fVar199;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar212;
  float fVar213;
  vfloat4 a0;
  undefined1 auVar205 [16];
  float fVar214;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_340;
  float local_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  long local_310;
  Primitive *local_308;
  ulong local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  RayQueryContext *local_270;
  RTCFilterFunctionNArguments local_268;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  uint auStack_188 [4];
  undefined8 local_178;
  float local_170;
  undefined8 local_16c;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar223 [32];
  
  PVar4 = prim[1];
  uVar29 = (ulong)(byte)PVar4;
  fVar203 = *(float *)(prim + uVar29 * 0x19 + 0x12);
  auVar74._16_16_ =
       vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                  *(undefined1 (*) [16])(prim + uVar29 * 0x19 + 6));
  fVar112 = fVar203 * auVar74._16_4_;
  fVar92 = fVar203 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar29 * 4 + 6);
  auVar61 = vpmovsxbd_avx2(auVar37);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar29 * 5 + 6);
  auVar59 = vpmovsxbd_avx2(auVar47);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar29 * 6 + 6);
  auVar66 = vpmovsxbd_avx2(auVar48);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar29 * 0xb + 6);
  auVar76 = vpmovsxbd_avx2(auVar49);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar70 = vpmovsxbd_avx2(auVar43);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77 = vcvtdq2ps_avx(auVar70);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar29 + 6);
  auVar60 = vpmovsxbd_avx2(auVar39);
  auVar60 = vcvtdq2ps_avx(auVar60);
  uVar32 = (ulong)(uint)((int)(uVar29 * 9) * 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar32 + 6);
  auVar67 = vpmovsxbd_avx2(auVar38);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar32 + uVar29 + 6);
  auVar68 = vpmovsxbd_avx2(auVar40);
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar25 = (ulong)(uint)((int)(uVar29 * 5) << 2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar25 + 6);
  auVar58 = vpmovsxbd_avx2(auVar41);
  auVar69 = vcvtdq2ps_avx(auVar58);
  auVar218._4_4_ = fVar92;
  auVar218._0_4_ = fVar92;
  auVar218._8_4_ = fVar92;
  auVar218._12_4_ = fVar92;
  auVar218._16_4_ = fVar92;
  auVar218._20_4_ = fVar92;
  auVar218._24_4_ = fVar92;
  auVar218._28_4_ = fVar92;
  auVar229._8_4_ = 1;
  auVar229._0_8_ = 0x100000001;
  auVar229._12_4_ = 1;
  auVar229._16_4_ = 1;
  auVar229._20_4_ = 1;
  auVar229._24_4_ = 1;
  auVar229._28_4_ = 1;
  auVar56 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar72 = ZEXT1632(CONCAT412(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar92))));
  auVar71 = vpermps_avx2(auVar229,auVar72);
  auVar57 = vpermps_avx512vl(auVar56,auVar72);
  fVar92 = auVar57._0_4_;
  fVar196 = auVar57._4_4_;
  auVar72._4_4_ = fVar196 * auVar66._4_4_;
  auVar72._0_4_ = fVar92 * auVar66._0_4_;
  fVar198 = auVar57._8_4_;
  auVar72._8_4_ = fVar198 * auVar66._8_4_;
  fVar200 = auVar57._12_4_;
  auVar72._12_4_ = fVar200 * auVar66._12_4_;
  fVar201 = auVar57._16_4_;
  auVar72._16_4_ = fVar201 * auVar66._16_4_;
  fVar202 = auVar57._20_4_;
  auVar72._20_4_ = fVar202 * auVar66._20_4_;
  fVar101 = auVar57._24_4_;
  auVar72._24_4_ = fVar101 * auVar66._24_4_;
  auVar72._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar60._4_4_ * fVar196;
  auVar70._0_4_ = auVar60._0_4_ * fVar92;
  auVar70._8_4_ = auVar60._8_4_ * fVar198;
  auVar70._12_4_ = auVar60._12_4_ * fVar200;
  auVar70._16_4_ = auVar60._16_4_ * fVar201;
  auVar70._20_4_ = auVar60._20_4_ * fVar202;
  auVar70._24_4_ = auVar60._24_4_ * fVar101;
  auVar70._28_4_ = auVar58._28_4_;
  auVar58._4_4_ = auVar69._4_4_ * fVar196;
  auVar58._0_4_ = auVar69._0_4_ * fVar92;
  auVar58._8_4_ = auVar69._8_4_ * fVar198;
  auVar58._12_4_ = auVar69._12_4_ * fVar200;
  auVar58._16_4_ = auVar69._16_4_ * fVar201;
  auVar58._20_4_ = auVar69._20_4_ * fVar202;
  auVar58._24_4_ = auVar69._24_4_ * fVar101;
  auVar58._28_4_ = auVar57._28_4_;
  auVar37 = vfmadd231ps_fma(auVar72,auVar71,auVar59);
  auVar47 = vfmadd231ps_fma(auVar70,auVar71,auVar77);
  auVar48 = vfmadd231ps_fma(auVar58,auVar68,auVar71);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar218,auVar61);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar218,auVar76);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar67,auVar218);
  auVar219._4_4_ = fVar112;
  auVar219._0_4_ = fVar112;
  auVar219._8_4_ = fVar112;
  auVar219._12_4_ = fVar112;
  auVar219._16_4_ = fVar112;
  auVar219._20_4_ = fVar112;
  auVar219._24_4_ = fVar112;
  auVar219._28_4_ = fVar112;
  auVar58 = ZEXT1632(CONCAT412(fVar203 * auVar74._28_4_,
                               CONCAT48(fVar203 * auVar74._24_4_,
                                        CONCAT44(fVar203 * auVar74._20_4_,fVar112))));
  auVar70 = vpermps_avx2(auVar229,auVar58);
  auVar58 = vpermps_avx512vl(auVar56,auVar58);
  fVar203 = auVar58._0_4_;
  fVar92 = auVar58._4_4_;
  auVar71._4_4_ = fVar92 * auVar66._4_4_;
  auVar71._0_4_ = fVar203 * auVar66._0_4_;
  fVar196 = auVar58._8_4_;
  auVar71._8_4_ = fVar196 * auVar66._8_4_;
  fVar198 = auVar58._12_4_;
  auVar71._12_4_ = fVar198 * auVar66._12_4_;
  fVar200 = auVar58._16_4_;
  auVar71._16_4_ = fVar200 * auVar66._16_4_;
  fVar201 = auVar58._20_4_;
  auVar71._20_4_ = fVar201 * auVar66._20_4_;
  fVar202 = auVar58._24_4_;
  auVar71._24_4_ = fVar202 * auVar66._24_4_;
  auVar71._28_4_ = 1;
  auVar56._4_4_ = auVar60._4_4_ * fVar92;
  auVar56._0_4_ = auVar60._0_4_ * fVar203;
  auVar56._8_4_ = auVar60._8_4_ * fVar196;
  auVar56._12_4_ = auVar60._12_4_ * fVar198;
  auVar56._16_4_ = auVar60._16_4_ * fVar200;
  auVar56._20_4_ = auVar60._20_4_ * fVar201;
  auVar56._24_4_ = auVar60._24_4_ * fVar202;
  auVar56._28_4_ = auVar66._28_4_;
  auVar60._4_4_ = auVar69._4_4_ * fVar92;
  auVar60._0_4_ = auVar69._0_4_ * fVar203;
  auVar60._8_4_ = auVar69._8_4_ * fVar196;
  auVar60._12_4_ = auVar69._12_4_ * fVar198;
  auVar60._16_4_ = auVar69._16_4_ * fVar200;
  auVar60._20_4_ = auVar69._20_4_ * fVar201;
  auVar60._24_4_ = auVar69._24_4_ * fVar202;
  auVar60._28_4_ = auVar58._28_4_;
  auVar49 = vfmadd231ps_fma(auVar71,auVar70,auVar59);
  auVar43 = vfmadd231ps_fma(auVar56,auVar70,auVar77);
  auVar39 = vfmadd231ps_fma(auVar60,auVar70,auVar68);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar219,auVar61);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar219,auVar76);
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  auVar80._16_4_ = 0x7fffffff;
  auVar80._20_4_ = 0x7fffffff;
  auVar80._24_4_ = 0x7fffffff;
  auVar80._28_4_ = 0x7fffffff;
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar219,auVar67);
  auVar61 = vandps_avx(ZEXT1632(auVar37),auVar80);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar134._16_4_ = 0x219392ef;
  auVar134._20_4_ = 0x219392ef;
  auVar134._24_4_ = 0x219392ef;
  auVar134._28_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar61,auVar134,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar57._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar37._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar37._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar37._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar37._12_4_;
  auVar57._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar57._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar57._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar57._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar47),auVar80);
  uVar32 = vcmpps_avx512vl(auVar61,auVar134,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar73._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar47._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar48),auVar80);
  uVar32 = vcmpps_avx512vl(auVar61,auVar134,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar61._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar48._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar48._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar48._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar48._12_4_;
  auVar61._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar61._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar61._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar61._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar59 = vrcp14ps_avx512vl(auVar57);
  auVar122._8_4_ = 0x3f800000;
  auVar122._0_8_ = 0x3f8000003f800000;
  auVar122._12_4_ = 0x3f800000;
  auVar122._16_4_ = 0x3f800000;
  auVar122._20_4_ = 0x3f800000;
  auVar122._24_4_ = 0x3f800000;
  auVar122._28_4_ = 0x3f800000;
  auVar37 = vfnmadd213ps_fma(auVar57,auVar59,auVar122);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar73);
  auVar47 = vfnmadd213ps_fma(auVar73,auVar59,auVar122);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar61);
  auVar48 = vfnmadd213ps_fma(auVar61,auVar59,auVar122);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar59,auVar59);
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 7 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar49));
  auVar67._4_4_ = auVar37._4_4_ * auVar61._4_4_;
  auVar67._0_4_ = auVar37._0_4_ * auVar61._0_4_;
  auVar67._8_4_ = auVar37._8_4_ * auVar61._8_4_;
  auVar67._12_4_ = auVar37._12_4_ * auVar61._12_4_;
  auVar67._16_4_ = auVar61._16_4_ * 0.0;
  auVar67._20_4_ = auVar61._20_4_ * 0.0;
  auVar67._24_4_ = auVar61._24_4_ * 0.0;
  auVar67._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 9 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar49));
  auVar60 = vpbroadcastd_avx512vl();
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar79._0_4_ = auVar37._0_4_ * auVar61._0_4_;
  auVar79._4_4_ = auVar37._4_4_ * auVar61._4_4_;
  auVar79._8_4_ = auVar37._8_4_ * auVar61._8_4_;
  auVar79._12_4_ = auVar37._12_4_ * auVar61._12_4_;
  auVar79._16_4_ = auVar61._16_4_ * 0.0;
  auVar79._20_4_ = auVar61._20_4_ * 0.0;
  auVar79._24_4_ = auVar61._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar29 * -2 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar43));
  auVar68._4_4_ = auVar47._4_4_ * auVar61._4_4_;
  auVar68._0_4_ = auVar47._0_4_ * auVar61._0_4_;
  auVar68._8_4_ = auVar47._8_4_ * auVar61._8_4_;
  auVar68._12_4_ = auVar47._12_4_ * auVar61._12_4_;
  auVar68._16_4_ = auVar61._16_4_ * 0.0;
  auVar68._20_4_ = auVar61._20_4_ * 0.0;
  auVar68._24_4_ = auVar61._24_4_ * 0.0;
  auVar68._28_4_ = auVar61._28_4_;
  auVar61 = vcvtdq2ps_avx(auVar59);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar43));
  auVar78._0_4_ = auVar47._0_4_ * auVar61._0_4_;
  auVar78._4_4_ = auVar47._4_4_ * auVar61._4_4_;
  auVar78._8_4_ = auVar47._8_4_ * auVar61._8_4_;
  auVar78._12_4_ = auVar47._12_4_ * auVar61._12_4_;
  auVar78._16_4_ = auVar61._16_4_ * 0.0;
  auVar78._20_4_ = auVar61._20_4_ * 0.0;
  auVar78._24_4_ = auVar61._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 + uVar29 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar39));
  auVar69._4_4_ = auVar61._4_4_ * auVar48._4_4_;
  auVar69._0_4_ = auVar61._0_4_ * auVar48._0_4_;
  auVar69._8_4_ = auVar61._8_4_ * auVar48._8_4_;
  auVar69._12_4_ = auVar61._12_4_ * auVar48._12_4_;
  auVar69._16_4_ = auVar61._16_4_ * 0.0;
  auVar69._20_4_ = auVar61._20_4_ * 0.0;
  auVar69._24_4_ = auVar61._24_4_ * 0.0;
  auVar69._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x17 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar39));
  auVar75._0_4_ = auVar48._0_4_ * auVar61._0_4_;
  auVar75._4_4_ = auVar48._4_4_ * auVar61._4_4_;
  auVar75._8_4_ = auVar48._8_4_ * auVar61._8_4_;
  auVar75._12_4_ = auVar48._12_4_ * auVar61._12_4_;
  auVar75._16_4_ = auVar61._16_4_ * 0.0;
  auVar75._20_4_ = auVar61._20_4_ * 0.0;
  auVar75._24_4_ = auVar61._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar61 = vpminsd_avx2(auVar67,auVar79);
  auVar59 = vpminsd_avx2(auVar68,auVar78);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59 = vpminsd_avx2(auVar69,auVar75);
  uVar93 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar66._4_4_ = uVar93;
  auVar66._0_4_ = uVar93;
  auVar66._8_4_ = uVar93;
  auVar66._12_4_ = uVar93;
  auVar66._16_4_ = uVar93;
  auVar66._20_4_ = uVar93;
  auVar66._24_4_ = uVar93;
  auVar66._28_4_ = uVar93;
  auVar59 = vmaxps_avx512vl(auVar59,auVar66);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59._8_4_ = 0x3f7ffffa;
  auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar59._12_4_ = 0x3f7ffffa;
  auVar59._16_4_ = 0x3f7ffffa;
  auVar59._20_4_ = 0x3f7ffffa;
  auVar59._24_4_ = 0x3f7ffffa;
  auVar59._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar61,auVar59);
  auVar61 = vpmaxsd_avx2(auVar67,auVar79);
  auVar59 = vpmaxsd_avx2(auVar68,auVar78);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar59 = vpmaxsd_avx2(auVar69,auVar75);
  fVar203 = (ray->super_RayK<1>).tfar;
  auVar76._4_4_ = fVar203;
  auVar76._0_4_ = fVar203;
  auVar76._8_4_ = fVar203;
  auVar76._12_4_ = fVar203;
  auVar76._16_4_ = fVar203;
  auVar76._20_4_ = fVar203;
  auVar76._24_4_ = fVar203;
  auVar76._28_4_ = fVar203;
  auVar59 = vminps_avx512vl(auVar59,auVar76);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar77._8_4_ = 0x3f800003;
  auVar77._0_8_ = 0x3f8000033f800003;
  auVar77._12_4_ = 0x3f800003;
  auVar77._16_4_ = 0x3f800003;
  auVar77._20_4_ = 0x3f800003;
  auVar77._24_4_ = 0x3f800003;
  auVar77._28_4_ = 0x3f800003;
  auVar61 = vmulps_avx512vl(auVar61,auVar77);
  uVar11 = vpcmpgtd_avx512vl(auVar60,_DAT_01fe9900);
  uVar10 = vcmpps_avx512vl(local_78,auVar61,2);
  if ((byte)((byte)uVar10 & (byte)uVar11) != 0) {
    uVar32 = (ulong)(byte)((byte)uVar10 & (byte)uVar11);
    auVar74._16_16_ = auVar61._16_16_;
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar231 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar232 = ZEXT1664(auVar37);
    auVar240 = ZEXT464(0x3f800000);
    do {
      lVar27 = 0;
      for (uVar25 = uVar32; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar31 = *(uint *)(prim + 2);
      pGVar6 = (context->scene->geometries).items[uVar31].ptr;
      local_300 = (ulong)*(uint *)(prim + lVar27 * 4 + 6);
      lVar7 = *(long *)&pGVar6[1].time_range.upper;
      uVar25 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               (ulong)*(uint *)(prim + lVar27 * 4 + 6) *
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar37 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar25);
      lVar27 = uVar25 + 1;
      auVar47 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar27);
      _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar48 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar25);
      auVar49 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar27);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar39 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar25
                            ),auVar37,auVar38);
      auVar40 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar27
                            ),auVar47,auVar38);
      auVar41 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + uVar25 * *(long *)&pGVar6[3].fnumTimeSegments
                            ),auVar48,auVar38);
      auVar42 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar27
                            ),auVar49,auVar38);
      auVar63._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar43 = vmulps_avx512vl(auVar47,auVar63._0_16_);
      auVar44 = vfmadd231ps_avx512vl(auVar43,auVar40,auVar63._0_16_);
      auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar44);
      auVar52._0_4_ = auVar37._0_4_ + auVar43._0_4_;
      auVar52._4_4_ = auVar37._4_4_ + auVar43._4_4_;
      auVar52._8_4_ = auVar37._8_4_ + auVar43._8_4_;
      auVar52._12_4_ = auVar37._12_4_ + auVar43._12_4_;
      auVar54 = auVar230._0_16_;
      auVar43 = vfmadd231ps_avx512vl(auVar44,auVar39,auVar54);
      auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar37,auVar54);
      auVar43 = vmulps_avx512vl(auVar49,auVar63._0_16_);
      auVar45 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar63._0_16_);
      auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar45);
      auVar205._0_4_ = auVar48._0_4_ + auVar43._0_4_;
      auVar205._4_4_ = auVar48._4_4_ + auVar43._4_4_;
      auVar205._8_4_ = auVar48._8_4_ + auVar43._8_4_;
      auVar205._12_4_ = auVar48._12_4_ + auVar43._12_4_;
      auVar43 = vfmadd231ps_avx512vl(auVar45,auVar41,auVar54);
      auVar45 = vfnmadd231ps_avx512vl(auVar43,auVar48,auVar54);
      auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar40,auVar47);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar39,auVar63._0_16_);
      auVar46 = vfmadd231ps_avx512vl(auVar43,auVar37,auVar63._0_16_);
      auVar47 = vmulps_avx512vl(auVar47,auVar54);
      auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar54,auVar40);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar63._0_16_,auVar39);
      auVar40 = vfnmadd231ps_avx512vl(auVar47,auVar63._0_16_,auVar37);
      auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar49);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar41,auVar63._0_16_);
      auVar43 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar63._0_16_);
      auVar37 = vmulps_avx512vl(auVar49,auVar54);
      auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar54,auVar42);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar63._0_16_,auVar41);
      auVar39 = vfnmadd231ps_avx512vl(auVar37,auVar63._0_16_,auVar48);
      auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
      auVar47 = vshufps_avx(auVar205,auVar205,0xc9);
      fVar112 = auVar44._0_4_;
      auVar137._0_4_ = fVar112 * auVar47._0_4_;
      fVar98 = auVar44._4_4_;
      auVar137._4_4_ = fVar98 * auVar47._4_4_;
      fVar99 = auVar44._8_4_;
      auVar137._8_4_ = fVar99 * auVar47._8_4_;
      fVar100 = auVar44._12_4_;
      auVar137._12_4_ = fVar100 * auVar47._12_4_;
      auVar47 = vfmsub231ps_fma(auVar137,auVar37,auVar205);
      auVar48 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar155._0_4_ = auVar47._0_4_ * fVar112;
      auVar155._4_4_ = auVar47._4_4_ * fVar98;
      auVar155._8_4_ = auVar47._8_4_ * fVar99;
      auVar155._12_4_ = auVar47._12_4_ * fVar100;
      auVar37 = vfmsub231ps_fma(auVar155,auVar37,auVar45);
      auVar49 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar37 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar47 = vshufps_avx(auVar43,auVar43,0xc9);
      fVar203 = auVar40._0_4_;
      auVar164._0_4_ = auVar47._0_4_ * fVar203;
      fVar92 = auVar40._4_4_;
      auVar164._4_4_ = auVar47._4_4_ * fVar92;
      fVar196 = auVar40._8_4_;
      auVar164._8_4_ = auVar47._8_4_ * fVar196;
      fVar198 = auVar40._12_4_;
      auVar164._12_4_ = auVar47._12_4_ * fVar198;
      auVar47 = vfmsub231ps_fma(auVar164,auVar37,auVar43);
      auVar43 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar165._0_4_ = auVar47._0_4_ * fVar203;
      auVar165._4_4_ = auVar47._4_4_ * fVar92;
      auVar165._8_4_ = auVar47._8_4_ * fVar196;
      auVar165._12_4_ = auVar47._12_4_ * fVar198;
      auVar37 = vfmsub231ps_fma(auVar165,auVar37,auVar39);
      auVar39 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar37 = vdpps_avx(auVar48,auVar48,0x7f);
      fVar200 = auVar37._0_4_;
      auVar63._16_16_ = auVar74._16_16_;
      auVar62._4_28_ = auVar63._4_28_;
      auVar62._0_4_ = fVar200;
      auVar47 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
      fVar201 = auVar47._0_4_;
      fVar202 = fVar201 * 1.5 - fVar200 * 0.5 * fVar201 * fVar201 * fVar201;
      auVar47 = vdpps_avx(auVar48,auVar49,0x7f);
      fVar204 = fVar202 * auVar48._0_4_;
      fVar212 = fVar202 * auVar48._4_4_;
      fVar213 = fVar202 * auVar48._8_4_;
      fVar214 = fVar202 * auVar48._12_4_;
      auVar156._0_4_ = fVar200 * auVar49._0_4_;
      auVar156._4_4_ = fVar200 * auVar49._4_4_;
      auVar156._8_4_ = fVar200 * auVar49._8_4_;
      auVar156._12_4_ = fVar200 * auVar49._12_4_;
      fVar200 = auVar47._0_4_;
      auVar138._0_4_ = fVar200 * auVar48._0_4_;
      auVar138._4_4_ = fVar200 * auVar48._4_4_;
      auVar138._8_4_ = fVar200 * auVar48._8_4_;
      auVar138._12_4_ = fVar200 * auVar48._12_4_;
      auVar48 = vsubps_avx(auVar156,auVar138);
      auVar47 = vrcp14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
      auVar37 = vfnmadd213ss_avx512f(auVar37,auVar47,ZEXT416(0x40000000));
      fVar200 = auVar47._0_4_ * auVar37._0_4_;
      auVar37 = vdpps_avx(auVar43,auVar43,0x7f);
      fVar201 = auVar37._0_4_;
      auVar65._16_16_ = auVar74._16_16_;
      auVar65._0_16_ = auVar63._0_16_;
      auVar64._4_28_ = auVar65._4_28_;
      auVar64._0_4_ = fVar201;
      auVar47 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
      fVar101 = auVar47._0_4_;
      fVar101 = fVar101 * 1.5 - fVar201 * 0.5 * fVar101 * fVar101 * fVar101;
      auVar47 = vdpps_avx(auVar43,auVar39,0x7f);
      fVar184 = fVar101 * auVar43._0_4_;
      fVar195 = fVar101 * auVar43._4_4_;
      fVar197 = fVar101 * auVar43._8_4_;
      fVar199 = fVar101 * auVar43._12_4_;
      auVar124._0_4_ = fVar201 * auVar39._0_4_;
      auVar124._4_4_ = fVar201 * auVar39._4_4_;
      auVar124._8_4_ = fVar201 * auVar39._8_4_;
      auVar124._12_4_ = fVar201 * auVar39._12_4_;
      fVar201 = auVar47._0_4_;
      auVar51._0_4_ = fVar201 * auVar43._0_4_;
      auVar51._4_4_ = fVar201 * auVar43._4_4_;
      auVar51._8_4_ = fVar201 * auVar43._8_4_;
      auVar51._12_4_ = fVar201 * auVar43._12_4_;
      auVar49 = vsubps_avx(auVar124,auVar51);
      auVar47 = vrcp14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
      auVar37 = vfnmadd213ss_avx512f(auVar37,auVar47,ZEXT416(0x40000000));
      fVar201 = auVar47._0_4_ * auVar37._0_4_;
      auVar37 = vshufps_avx(auVar52,auVar52,0xff);
      auVar147._0_4_ = fVar204 * auVar37._0_4_;
      auVar147._4_4_ = fVar212 * auVar37._4_4_;
      auVar147._8_4_ = fVar213 * auVar37._8_4_;
      auVar147._12_4_ = fVar214 * auVar37._12_4_;
      local_1c8 = vsubps_avx(auVar52,auVar147);
      auVar47 = vshufps_avx(auVar44,auVar44,0xff);
      auVar125._0_4_ = auVar47._0_4_ * fVar204 + auVar37._0_4_ * fVar202 * fVar200 * auVar48._0_4_;
      auVar125._4_4_ = auVar47._4_4_ * fVar212 + auVar37._4_4_ * fVar202 * fVar200 * auVar48._4_4_;
      auVar125._8_4_ = auVar47._8_4_ * fVar213 + auVar37._8_4_ * fVar202 * fVar200 * auVar48._8_4_;
      auVar125._12_4_ =
           auVar47._12_4_ * fVar214 + auVar37._12_4_ * fVar202 * fVar200 * auVar48._12_4_;
      auVar48 = vsubps_avx(auVar44,auVar125);
      local_1d8._0_4_ = auVar52._0_4_ + auVar147._0_4_;
      local_1d8._4_4_ = auVar52._4_4_ + auVar147._4_4_;
      fStack_1d0 = auVar52._8_4_ + auVar147._8_4_;
      fStack_1cc = auVar52._12_4_ + auVar147._12_4_;
      auVar44._0_4_ = fVar112 + auVar125._0_4_;
      auVar44._4_4_ = fVar98 + auVar125._4_4_;
      auVar44._8_4_ = fVar99 + auVar125._8_4_;
      auVar44._12_4_ = fVar100 + auVar125._12_4_;
      auVar37 = vshufps_avx(auVar46,auVar46,0xff);
      auVar126._0_4_ = fVar184 * auVar37._0_4_;
      auVar126._4_4_ = fVar195 * auVar37._4_4_;
      auVar126._8_4_ = fVar197 * auVar37._8_4_;
      auVar126._12_4_ = fVar199 * auVar37._12_4_;
      local_1e8 = vsubps_avx(auVar46,auVar126);
      auVar47 = vshufps_avx(auVar40,auVar40,0xff);
      auVar54._0_4_ = fVar184 * auVar47._0_4_ + auVar37._0_4_ * fVar101 * auVar49._0_4_ * fVar201;
      auVar54._4_4_ = fVar195 * auVar47._4_4_ + auVar37._4_4_ * fVar101 * auVar49._4_4_ * fVar201;
      auVar54._8_4_ = fVar197 * auVar47._8_4_ + auVar37._8_4_ * fVar101 * auVar49._8_4_ * fVar201;
      auVar54._12_4_ =
           fVar199 * auVar47._12_4_ + auVar37._12_4_ * fVar101 * auVar49._12_4_ * fVar201;
      auVar37 = vsubps_avx(auVar40,auVar54);
      _local_1f8 = vaddps_avx512vl(auVar46,auVar126);
      auVar46._0_4_ = fVar203 + auVar54._0_4_;
      auVar46._4_4_ = fVar92 + auVar54._4_4_;
      auVar46._8_4_ = fVar196 + auVar54._8_4_;
      auVar46._12_4_ = fVar198 + auVar54._12_4_;
      auVar47 = vmulps_avx512vl(auVar48,auVar38);
      local_208 = vaddps_avx512vl(local_1c8,auVar47);
      auVar37 = vmulps_avx512vl(auVar37,auVar38);
      local_218 = vsubps_avx512vl(local_1e8,auVar37);
      auVar37 = vmulps_avx512vl(auVar44,auVar38);
      _local_228 = vaddps_avx512vl(_local_1d8,auVar37);
      auVar37 = vmulps_avx512vl(auVar46,auVar38);
      _local_238 = vsubps_avx512vl(_local_1f8,auVar37);
      aVar1 = (ray->super_RayK<1>).org.field_0;
      auVar47 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar53._4_4_ = uVar93;
      auVar53._0_4_ = uVar93;
      auVar53._8_4_ = uVar93;
      auVar53._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      aVar2 = (pre->ray_space).vx.field_0;
      aVar3 = (pre->ray_space).vy.field_0;
      fVar203 = (pre->ray_space).vz.field_0.m128[0];
      fVar92 = (pre->ray_space).vz.field_0.m128[1];
      fVar196 = (pre->ray_space).vz.field_0.m128[2];
      fVar198 = (pre->ray_space).vz.field_0.m128[3];
      auVar45._0_4_ = fVar203 * auVar47._0_4_;
      auVar45._4_4_ = fVar92 * auVar47._4_4_;
      auVar45._8_4_ = fVar196 * auVar47._8_4_;
      auVar45._12_4_ = fVar198 * auVar47._12_4_;
      auVar37 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar37);
      auVar43 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar53);
      auVar47 = vsubps_avx512vl(local_208,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar104._4_4_ = uVar93;
      auVar104._0_4_ = uVar93;
      auVar104._8_4_ = uVar93;
      auVar104._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar102._0_4_ = fVar203 * auVar47._0_4_;
      auVar102._4_4_ = fVar92 * auVar47._4_4_;
      auVar102._8_4_ = fVar196 * auVar47._8_4_;
      auVar102._12_4_ = fVar198 * auVar47._12_4_;
      auVar37 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar3,auVar37);
      auVar39 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar104);
      auVar47 = vsubps_avx512vl(local_218,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar139._4_4_ = uVar93;
      auVar139._0_4_ = uVar93;
      auVar139._8_4_ = uVar93;
      auVar139._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar50._0_4_ = fVar203 * auVar47._0_4_;
      auVar50._4_4_ = fVar92 * auVar47._4_4_;
      auVar50._8_4_ = fVar196 * auVar47._8_4_;
      auVar50._12_4_ = fVar198 * auVar47._12_4_;
      auVar37 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar37);
      auVar38 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar139);
      auVar47 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar157._4_4_ = uVar93;
      auVar157._0_4_ = uVar93;
      auVar157._8_4_ = uVar93;
      auVar157._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar140._0_4_ = fVar203 * auVar47._0_4_;
      auVar140._4_4_ = fVar92 * auVar47._4_4_;
      auVar140._8_4_ = fVar196 * auVar47._8_4_;
      auVar140._12_4_ = fVar198 * auVar47._12_4_;
      auVar37 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar3,auVar37);
      auVar40 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar157);
      auVar47 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar166._4_4_ = uVar93;
      auVar166._0_4_ = uVar93;
      auVar166._8_4_ = uVar93;
      auVar166._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar158._0_4_ = auVar47._0_4_ * fVar203;
      auVar158._4_4_ = auVar47._4_4_ * fVar92;
      auVar158._8_4_ = auVar47._8_4_ * fVar196;
      auVar158._12_4_ = auVar47._12_4_ * fVar198;
      auVar37 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar3,auVar37);
      auVar41 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar166);
      auVar47 = vsubps_avx512vl(_local_228,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar177._4_4_ = uVar93;
      auVar177._0_4_ = uVar93;
      auVar177._8_4_ = uVar93;
      auVar177._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar167._0_4_ = auVar47._0_4_ * fVar203;
      auVar167._4_4_ = auVar47._4_4_ * fVar92;
      auVar167._8_4_ = auVar47._8_4_ * fVar196;
      auVar167._12_4_ = auVar47._12_4_ * fVar198;
      auVar37 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar3,auVar37);
      auVar74._16_16_ = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar177);
      auVar47 = vsubps_avx512vl(_local_238,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar185._4_4_ = uVar93;
      auVar185._0_4_ = uVar93;
      auVar185._8_4_ = uVar93;
      auVar185._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar178._0_4_ = auVar47._0_4_ * fVar203;
      auVar178._4_4_ = auVar47._4_4_ * fVar92;
      auVar178._8_4_ = auVar47._8_4_ * fVar196;
      auVar178._12_4_ = auVar47._12_4_ * fVar198;
      auVar37 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar3,auVar37);
      auVar42 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar185);
      auVar47 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar1);
      uVar93 = auVar47._0_4_;
      auVar186._4_4_ = uVar93;
      auVar186._0_4_ = uVar93;
      auVar186._8_4_ = uVar93;
      auVar186._12_4_ = uVar93;
      auVar37 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar55._0_4_ = fVar203 * auVar47._0_4_;
      auVar55._4_4_ = fVar92 * auVar47._4_4_;
      auVar55._8_4_ = fVar196 * auVar47._8_4_;
      auVar55._12_4_ = fVar198 * auVar47._12_4_;
      auVar37 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar37);
      auVar44 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar186);
      local_288 = vmovlhps_avx(auVar43,auVar41);
      local_298 = vmovlhps_avx512f(auVar39,auVar74._16_16_);
      local_198 = vmovlhps_avx512f(auVar38,auVar42);
      _local_f8 = vmovlhps_avx512f(auVar40,auVar44);
      auVar37 = vminps_avx512vl(local_288,local_298);
      auVar48 = vmaxps_avx512vl(local_288,local_298);
      auVar47 = vminps_avx512vl(local_198,_local_f8);
      auVar47 = vminps_avx(auVar37,auVar47);
      auVar37 = vmaxps_avx512vl(local_198,_local_f8);
      auVar37 = vmaxps_avx(auVar48,auVar37);
      auVar48 = vshufpd_avx(auVar47,auVar47,3);
      auVar49 = vshufpd_avx(auVar37,auVar37,3);
      auVar47 = vminps_avx(auVar47,auVar48);
      auVar37 = vmaxps_avx(auVar37,auVar49);
      auVar47 = vandps_avx512vl(auVar47,auVar231._0_16_);
      auVar37 = vandps_avx512vl(auVar37,auVar231._0_16_);
      auVar37 = vmaxps_avx(auVar47,auVar37);
      auVar47 = vmovshdup_avx(auVar37);
      auVar37 = vmaxss_avx(auVar47,auVar37);
      local_310 = uVar32 + 0xff;
      local_1a8 = vmovddup_avx512vl(auVar43);
      auVar237 = ZEXT1664(local_1a8);
      local_1b8 = vmovddup_avx512vl(auVar39);
      auVar239 = ZEXT1664(local_1b8);
      local_2a8._8_8_ = auVar38._0_8_;
      local_2a8._0_8_ = auVar38._0_8_;
      local_2b8._8_8_ = auVar40._0_8_;
      local_2b8._0_8_ = auVar40._0_8_;
      register0x00001348 = auVar41._0_8_;
      local_2c8 = auVar41._0_8_;
      register0x00001388 = auVar74._16_8_;
      local_2d8 = auVar74._16_8_;
      register0x00001408 = auVar42._0_8_;
      local_2e8 = auVar42._0_8_;
      register0x00001448 = auVar44._0_8_;
      local_2f8 = auVar44._0_8_;
      local_e8 = ZEXT416((uint)(auVar37._0_4_ * 9.536743e-07));
      local_b8 = vbroadcastss_avx512vl(local_e8);
      auVar37 = vxorps_avx512vl(local_b8._0_16_,auVar232._0_16_);
      local_d8 = vbroadcastss_avx512vl(auVar37);
      local_328 = vsubps_avx512vl(local_298,local_288);
      local_338 = vsubps_avx512vl(local_198,local_298);
      local_108 = vsubps_avx512vl(_local_f8,local_198);
      local_118 = vsubps_avx(_local_1d8,local_1c8);
      local_128 = vsubps_avx512vl(_local_228,local_208);
      local_138 = vsubps_avx512vl(_local_238,local_218);
      _local_148 = vsubps_avx512vl(_local_1f8,local_1e8);
      uVar25 = 0;
      auVar37 = ZEXT816(0x3f80000000000000);
      local_308 = prim;
      auVar42 = auVar37;
LAB_01cf9cc9:
      auVar47 = vshufps_avx(auVar42,auVar42,0x50);
      auVar220._8_4_ = 0x3f800000;
      auVar220._0_8_ = 0x3f8000003f800000;
      auVar220._12_4_ = 0x3f800000;
      auVar223._16_4_ = 0x3f800000;
      auVar223._0_16_ = auVar220;
      auVar223._20_4_ = 0x3f800000;
      auVar223._24_4_ = 0x3f800000;
      auVar223._28_4_ = 0x3f800000;
      auVar48 = vsubps_avx(auVar220,auVar47);
      fVar203 = auVar47._0_4_;
      auVar119._0_4_ = local_2c8._0_4_ * fVar203;
      fVar92 = auVar47._4_4_;
      auVar119._4_4_ = local_2c8._4_4_ * fVar92;
      fVar196 = auVar47._8_4_;
      auVar119._8_4_ = local_2c8._8_4_ * fVar196;
      fVar198 = auVar47._12_4_;
      auVar119._12_4_ = local_2c8._12_4_ * fVar198;
      auVar127._0_4_ = local_2d8._0_4_ * fVar203;
      auVar127._4_4_ = local_2d8._4_4_ * fVar92;
      auVar127._8_4_ = local_2d8._8_4_ * fVar196;
      auVar127._12_4_ = local_2d8._12_4_ * fVar198;
      auVar141._0_4_ = local_2e8._0_4_ * fVar203;
      auVar141._4_4_ = local_2e8._4_4_ * fVar92;
      auVar141._8_4_ = local_2e8._8_4_ * fVar196;
      auVar141._12_4_ = local_2e8._12_4_ * fVar198;
      auVar105._0_4_ = local_2f8._0_4_ * fVar203;
      auVar105._4_4_ = local_2f8._4_4_ * fVar92;
      auVar105._8_4_ = local_2f8._8_4_ * fVar196;
      auVar105._12_4_ = local_2f8._12_4_ * fVar198;
      auVar43 = vfmadd231ps_avx512vl(auVar119,auVar48,auVar237._0_16_);
      auVar39 = vfmadd231ps_avx512vl(auVar127,auVar48,auVar239._0_16_);
      auVar49 = vfmadd231ps_fma(auVar141,auVar48,local_2a8);
      auVar48 = vfmadd231ps_fma(auVar105,local_2b8,auVar48);
      auVar47 = vmovshdup_avx(auVar37);
      fVar92 = auVar37._0_4_;
      fVar203 = (auVar47._0_4_ - fVar92) * 0.04761905;
      auVar163._4_4_ = fVar92;
      auVar163._0_4_ = fVar92;
      auVar163._8_4_ = fVar92;
      auVar163._12_4_ = fVar92;
      auVar163._16_4_ = fVar92;
      auVar163._20_4_ = fVar92;
      auVar163._24_4_ = fVar92;
      auVar163._28_4_ = fVar92;
      auVar117._0_8_ = auVar47._0_8_;
      auVar117._8_8_ = auVar117._0_8_;
      auVar117._16_8_ = auVar117._0_8_;
      auVar117._24_8_ = auVar117._0_8_;
      auVar61 = vsubps_avx(auVar117,auVar163);
      uVar93 = auVar43._0_4_;
      auVar118._4_4_ = uVar93;
      auVar118._0_4_ = uVar93;
      auVar118._8_4_ = uVar93;
      auVar118._12_4_ = uVar93;
      auVar118._16_4_ = uVar93;
      auVar118._20_4_ = uVar93;
      auVar118._24_4_ = uVar93;
      auVar118._28_4_ = uVar93;
      auVar181._8_4_ = 1;
      auVar181._0_8_ = 0x100000001;
      auVar181._12_4_ = 1;
      auVar181._16_4_ = 1;
      auVar181._20_4_ = 1;
      auVar181._24_4_ = 1;
      auVar181._28_4_ = 1;
      auVar76 = ZEXT1632(auVar43);
      auVar59 = vpermps_avx2(auVar181,auVar76);
      auVar66 = vbroadcastss_avx512vl(auVar39);
      auVar77 = ZEXT1632(auVar39);
      auVar60 = vpermps_avx512vl(auVar181,auVar77);
      auVar67 = vbroadcastss_avx512vl(auVar49);
      auVar74 = ZEXT1632(auVar49);
      auVar68 = vpermps_avx512vl(auVar181,auVar74);
      auVar69 = vbroadcastss_avx512vl(auVar48);
      auVar73 = ZEXT1632(auVar48);
      auVar70 = vpermps_avx512vl(auVar181,auVar73);
      auVar182._4_4_ = fVar203;
      auVar182._0_4_ = fVar203;
      auVar182._8_4_ = fVar203;
      auVar182._12_4_ = fVar203;
      auVar182._16_4_ = fVar203;
      auVar182._20_4_ = fVar203;
      auVar182._24_4_ = fVar203;
      auVar182._28_4_ = fVar203;
      auVar58 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar71 = vpermps_avx512vl(auVar58,auVar76);
      auVar154._8_4_ = 3;
      auVar154._0_8_ = 0x300000003;
      auVar154._12_4_ = 3;
      auVar154._16_4_ = 3;
      auVar154._20_4_ = 3;
      auVar154._24_4_ = 3;
      auVar154._28_4_ = 3;
      auVar72 = vpermps_avx512vl(auVar154,auVar76);
      auVar56 = vpermps_avx512vl(auVar58,auVar77);
      auVar76 = vpermps_avx2(auVar154,auVar77);
      auVar57 = vpermps_avx512vl(auVar58,auVar74);
      auVar77 = vpermps_avx2(auVar154,auVar74);
      auVar58 = vpermps_avx512vl(auVar58,auVar73);
      auVar73 = vpermps_avx512vl(auVar154,auVar73);
      auVar47 = vfmadd132ps_fma(auVar61,auVar163,_DAT_01faff20);
      auVar61 = vsubps_avx(auVar223,ZEXT1632(auVar47));
      auVar74 = vmulps_avx512vl(auVar66,ZEXT1632(auVar47));
      auVar78 = ZEXT1632(auVar47);
      auVar75 = vmulps_avx512vl(auVar60,auVar78);
      auVar48 = vfmadd231ps_fma(auVar74,auVar61,auVar118);
      auVar49 = vfmadd231ps_fma(auVar75,auVar61,auVar59);
      auVar74 = vmulps_avx512vl(auVar67,auVar78);
      auVar75 = vmulps_avx512vl(auVar68,auVar78);
      auVar66 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar66);
      auVar60 = vfmadd231ps_avx512vl(auVar75,auVar61,auVar60);
      auVar74 = vmulps_avx512vl(auVar69,auVar78);
      auVar75 = ZEXT1632(auVar47);
      auVar70 = vmulps_avx512vl(auVar70,auVar75);
      auVar67 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar67);
      auVar68 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar68);
      fVar196 = auVar47._0_4_;
      fVar198 = auVar47._4_4_;
      auVar16._4_4_ = fVar198 * auVar66._4_4_;
      auVar16._0_4_ = fVar196 * auVar66._0_4_;
      fVar200 = auVar47._8_4_;
      auVar16._8_4_ = fVar200 * auVar66._8_4_;
      fVar201 = auVar47._12_4_;
      auVar16._12_4_ = fVar201 * auVar66._12_4_;
      auVar16._16_4_ = auVar66._16_4_ * 0.0;
      auVar16._20_4_ = auVar66._20_4_ * 0.0;
      auVar16._24_4_ = auVar66._24_4_ * 0.0;
      auVar16._28_4_ = fVar92;
      auVar17._4_4_ = fVar198 * auVar60._4_4_;
      auVar17._0_4_ = fVar196 * auVar60._0_4_;
      auVar17._8_4_ = fVar200 * auVar60._8_4_;
      auVar17._12_4_ = fVar201 * auVar60._12_4_;
      auVar17._16_4_ = auVar60._16_4_ * 0.0;
      auVar17._20_4_ = auVar60._20_4_ * 0.0;
      auVar17._24_4_ = auVar60._24_4_ * 0.0;
      auVar17._28_4_ = auVar59._28_4_;
      auVar48 = vfmadd231ps_fma(auVar16,auVar61,ZEXT1632(auVar48));
      auVar49 = vfmadd231ps_fma(auVar17,auVar61,ZEXT1632(auVar49));
      auVar110._0_4_ = fVar196 * auVar67._0_4_;
      auVar110._4_4_ = fVar198 * auVar67._4_4_;
      auVar110._8_4_ = fVar200 * auVar67._8_4_;
      auVar110._12_4_ = fVar201 * auVar67._12_4_;
      auVar110._16_4_ = auVar67._16_4_ * 0.0;
      auVar110._20_4_ = auVar67._20_4_ * 0.0;
      auVar110._24_4_ = auVar67._24_4_ * 0.0;
      auVar110._28_4_ = 0;
      auVar18._4_4_ = fVar198 * auVar68._4_4_;
      auVar18._0_4_ = fVar196 * auVar68._0_4_;
      auVar18._8_4_ = fVar200 * auVar68._8_4_;
      auVar18._12_4_ = fVar201 * auVar68._12_4_;
      auVar18._16_4_ = auVar68._16_4_ * 0.0;
      auVar18._20_4_ = auVar68._20_4_ * 0.0;
      auVar18._24_4_ = auVar68._24_4_ * 0.0;
      auVar18._28_4_ = auVar67._28_4_;
      auVar43 = vfmadd231ps_fma(auVar110,auVar61,auVar66);
      auVar39 = vfmadd231ps_fma(auVar18,auVar61,auVar60);
      auVar19._28_4_ = auVar60._28_4_;
      auVar19._0_28_ =
           ZEXT1628(CONCAT412(fVar201 * auVar39._12_4_,
                              CONCAT48(fVar200 * auVar39._8_4_,
                                       CONCAT44(fVar198 * auVar39._4_4_,fVar196 * auVar39._0_4_))));
      auVar38 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar201 * auVar43._12_4_,
                                                   CONCAT48(fVar200 * auVar43._8_4_,
                                                            CONCAT44(fVar198 * auVar43._4_4_,
                                                                     fVar196 * auVar43._0_4_)))),
                                auVar61,ZEXT1632(auVar48));
      auVar40 = vfmadd231ps_fma(auVar19,auVar61,ZEXT1632(auVar49));
      auVar59 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar48));
      auVar66 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar49));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar59 = vmulps_avx512vl(auVar59,auVar60);
      auVar66 = vmulps_avx512vl(auVar66,auVar60);
      auVar176._0_4_ = fVar203 * auVar59._0_4_;
      auVar176._4_4_ = fVar203 * auVar59._4_4_;
      auVar176._8_4_ = fVar203 * auVar59._8_4_;
      auVar176._12_4_ = fVar203 * auVar59._12_4_;
      auVar176._16_4_ = fVar203 * auVar59._16_4_;
      auVar176._20_4_ = fVar203 * auVar59._20_4_;
      auVar176._24_4_ = fVar203 * auVar59._24_4_;
      auVar176._28_4_ = 0;
      auVar59 = vmulps_avx512vl(auVar182,auVar66);
      auVar49 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
      auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_01feed00,ZEXT1632(auVar49));
      auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_01feed00,ZEXT1632(auVar49));
      auVar111._0_4_ = auVar176._0_4_ + auVar38._0_4_;
      auVar111._4_4_ = auVar176._4_4_ + auVar38._4_4_;
      auVar111._8_4_ = auVar176._8_4_ + auVar38._8_4_;
      auVar111._12_4_ = auVar176._12_4_ + auVar38._12_4_;
      auVar111._16_4_ = auVar176._16_4_ + 0.0;
      auVar111._20_4_ = auVar176._20_4_ + 0.0;
      auVar111._24_4_ = auVar176._24_4_ + 0.0;
      auVar111._28_4_ = 0;
      auVar78 = ZEXT1632(auVar49);
      auVar68 = vpermt2ps_avx512vl(auVar176,_DAT_01feed00,auVar78);
      auVar69 = vaddps_avx512vl(ZEXT1632(auVar40),auVar59);
      auVar70 = vpermt2ps_avx512vl(auVar59,_DAT_01feed00,auVar78);
      auVar59 = vsubps_avx(auVar66,auVar68);
      auVar68 = vsubps_avx512vl(auVar67,auVar70);
      auVar70 = vmulps_avx512vl(auVar56,auVar75);
      auVar74 = vmulps_avx512vl(auVar76,auVar75);
      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar71);
      auVar71 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar72);
      auVar72 = vmulps_avx512vl(auVar57,auVar75);
      auVar74 = vmulps_avx512vl(auVar77,auVar75);
      auVar72 = vfmadd231ps_avx512vl(auVar72,auVar61,auVar56);
      auVar76 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar76);
      auVar58 = vmulps_avx512vl(auVar58,auVar75);
      auVar56 = vmulps_avx512vl(auVar73,auVar75);
      auVar48 = vfmadd231ps_fma(auVar58,auVar61,auVar57);
      auVar58 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar77);
      auVar56 = vmulps_avx512vl(auVar75,auVar72);
      auVar73 = ZEXT1632(auVar47);
      auVar57 = vmulps_avx512vl(auVar73,auVar76);
      auVar70 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar70);
      auVar71 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar71);
      auVar58 = vmulps_avx512vl(auVar73,auVar58);
      auVar72 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar201 * auVar48._12_4_,
                                              CONCAT48(fVar200 * auVar48._8_4_,
                                                       CONCAT44(fVar198 * auVar48._4_4_,
                                                                fVar196 * auVar48._0_4_)))),auVar61,
                           auVar72);
      auVar76 = vfmadd231ps_avx512vl(auVar58,auVar61,auVar76);
      auVar20._4_4_ = fVar198 * auVar72._4_4_;
      auVar20._0_4_ = fVar196 * auVar72._0_4_;
      auVar20._8_4_ = fVar200 * auVar72._8_4_;
      auVar20._12_4_ = fVar201 * auVar72._12_4_;
      auVar20._16_4_ = auVar72._16_4_ * 0.0;
      auVar20._20_4_ = auVar72._20_4_ * 0.0;
      auVar20._24_4_ = auVar72._24_4_ * 0.0;
      auVar20._28_4_ = auVar77._28_4_;
      auVar77 = vmulps_avx512vl(auVar73,auVar76);
      auVar58 = vfmadd231ps_avx512vl(auVar20,auVar61,auVar70);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar61);
      auVar61 = vsubps_avx512vl(auVar72,auVar70);
      auVar76 = vsubps_avx512vl(auVar76,auVar71);
      auVar61 = vmulps_avx512vl(auVar61,auVar60);
      auVar76 = vmulps_avx512vl(auVar76,auVar60);
      fVar92 = fVar203 * auVar61._0_4_;
      fVar196 = fVar203 * auVar61._4_4_;
      auVar21._4_4_ = fVar196;
      auVar21._0_4_ = fVar92;
      fVar198 = fVar203 * auVar61._8_4_;
      auVar21._8_4_ = fVar198;
      fVar200 = fVar203 * auVar61._12_4_;
      auVar21._12_4_ = fVar200;
      fVar201 = fVar203 * auVar61._16_4_;
      auVar21._16_4_ = fVar201;
      fVar202 = fVar203 * auVar61._20_4_;
      auVar21._20_4_ = fVar202;
      fVar203 = fVar203 * auVar61._24_4_;
      auVar21._24_4_ = fVar203;
      auVar21._28_4_ = auVar61._28_4_;
      auVar76 = vmulps_avx512vl(auVar182,auVar76);
      auVar60 = vpermt2ps_avx512vl(auVar58,_DAT_01feed00,auVar78);
      auVar70 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar78);
      auVar183._0_4_ = auVar58._0_4_ + fVar92;
      auVar183._4_4_ = auVar58._4_4_ + fVar196;
      auVar183._8_4_ = auVar58._8_4_ + fVar198;
      auVar183._12_4_ = auVar58._12_4_ + fVar200;
      auVar183._16_4_ = auVar58._16_4_ + fVar201;
      auVar183._20_4_ = auVar58._20_4_ + fVar202;
      auVar183._24_4_ = auVar58._24_4_ + fVar203;
      auVar183._28_4_ = auVar58._28_4_ + auVar61._28_4_;
      auVar61 = vpermt2ps_avx512vl(auVar21,_DAT_01feed00,ZEXT1632(auVar49));
      auVar71 = vaddps_avx512vl(auVar77,auVar76);
      auVar76 = vpermt2ps_avx512vl(auVar76,_DAT_01feed00,ZEXT1632(auVar49));
      auVar61 = vsubps_avx(auVar60,auVar61);
      auVar76 = vsubps_avx512vl(auVar70,auVar76);
      in_ZMM17 = ZEXT3264(auVar76);
      auVar122 = ZEXT1632(auVar38);
      auVar72 = vsubps_avx512vl(auVar58,auVar122);
      auVar134 = ZEXT1632(auVar40);
      auVar56 = vsubps_avx512vl(auVar77,auVar134);
      auVar57 = vsubps_avx512vl(auVar60,auVar66);
      auVar72 = vaddps_avx512vl(auVar72,auVar57);
      auVar57 = vsubps_avx512vl(auVar70,auVar67);
      auVar56 = vaddps_avx512vl(auVar56,auVar57);
      auVar57 = vmulps_avx512vl(auVar134,auVar72);
      auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar122,auVar56);
      auVar73 = vmulps_avx512vl(auVar69,auVar72);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar111,auVar56);
      auVar74 = vmulps_avx512vl(auVar68,auVar72);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar59,auVar56);
      auVar75 = vmulps_avx512vl(auVar67,auVar72);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar66,auVar56);
      auVar78 = vmulps_avx512vl(auVar77,auVar72);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar58,auVar56);
      auVar79 = vmulps_avx512vl(auVar71,auVar72);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar183,auVar56);
      auVar80 = vmulps_avx512vl(auVar76,auVar72);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar61,auVar56);
      auVar72 = vmulps_avx512vl(auVar70,auVar72);
      auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar60,auVar56);
      auVar56 = vminps_avx512vl(auVar57,auVar73);
      auVar57 = vmaxps_avx512vl(auVar57,auVar73);
      auVar73 = vminps_avx512vl(auVar74,auVar75);
      auVar56 = vminps_avx512vl(auVar56,auVar73);
      auVar73 = vmaxps_avx512vl(auVar74,auVar75);
      auVar57 = vmaxps_avx512vl(auVar57,auVar73);
      auVar73 = vminps_avx512vl(auVar78,auVar79);
      auVar74 = vmaxps_avx512vl(auVar78,auVar79);
      auVar75 = vminps_avx512vl(auVar80,auVar72);
      auVar73 = vminps_avx512vl(auVar73,auVar75);
      auVar56 = vminps_avx512vl(auVar56,auVar73);
      auVar72 = vmaxps_avx512vl(auVar80,auVar72);
      auVar72 = vmaxps_avx512vl(auVar74,auVar72);
      auVar72 = vmaxps_avx512vl(auVar57,auVar72);
      uVar10 = vcmpps_avx512vl(auVar56,local_b8,2);
      uVar11 = vcmpps_avx512vl(auVar72,local_d8,5);
      bVar23 = (byte)uVar10 & (byte)uVar11 & 0x7f;
      if (bVar23 != 0) {
        auVar72 = vsubps_avx512vl(auVar66,auVar122);
        auVar56 = vsubps_avx512vl(auVar67,auVar134);
        auVar57 = vsubps_avx512vl(auVar60,auVar58);
        auVar72 = vaddps_avx512vl(auVar72,auVar57);
        auVar57 = vsubps_avx512vl(auVar70,auVar77);
        auVar56 = vaddps_avx512vl(auVar56,auVar57);
        auVar57 = vmulps_avx512vl(auVar134,auVar72);
        auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar56,auVar122);
        auVar69 = vmulps_avx512vl(auVar69,auVar72);
        auVar69 = vfnmadd213ps_avx512vl(auVar111,auVar56,auVar69);
        auVar68 = vmulps_avx512vl(auVar68,auVar72);
        auVar68 = vfnmadd213ps_avx512vl(auVar59,auVar56,auVar68);
        auVar59 = vmulps_avx512vl(auVar67,auVar72);
        auVar67 = vfnmadd231ps_avx512vl(auVar59,auVar56,auVar66);
        auVar59 = vmulps_avx512vl(auVar77,auVar72);
        auVar77 = vfnmadd231ps_avx512vl(auVar59,auVar56,auVar58);
        auVar59 = vmulps_avx512vl(auVar71,auVar72);
        auVar58 = vfnmadd213ps_avx512vl(auVar183,auVar56,auVar59);
        auVar59 = vmulps_avx512vl(auVar76,auVar72);
        auVar71 = vfnmadd213ps_avx512vl(auVar61,auVar56,auVar59);
        auVar61 = vmulps_avx512vl(auVar70,auVar72);
        auVar60 = vfnmadd231ps_avx512vl(auVar61,auVar60,auVar56);
        auVar59 = vminps_avx(auVar57,auVar69);
        auVar61 = vmaxps_avx(auVar57,auVar69);
        auVar66 = vminps_avx(auVar68,auVar67);
        auVar66 = vminps_avx(auVar59,auVar66);
        auVar59 = vmaxps_avx(auVar68,auVar67);
        auVar61 = vmaxps_avx(auVar61,auVar59);
        auVar76 = vminps_avx(auVar77,auVar58);
        auVar59 = vmaxps_avx(auVar77,auVar58);
        auVar77 = vminps_avx(auVar71,auVar60);
        auVar76 = vminps_avx(auVar76,auVar77);
        auVar76 = vminps_avx(auVar66,auVar76);
        auVar66 = vmaxps_avx(auVar71,auVar60);
        auVar59 = vmaxps_avx(auVar59,auVar66);
        auVar61 = vmaxps_avx(auVar61,auVar59);
        uVar10 = vcmpps_avx512vl(auVar61,local_d8,5);
        uVar11 = vcmpps_avx512vl(auVar76,local_b8,2);
        bVar23 = bVar23 & (byte)uVar10 & (byte)uVar11;
        if (bVar23 != 0) {
          auStack_188[uVar25] = (uint)bVar23;
          uVar10 = vmovlps_avx(auVar37);
          (&uStack_98)[uVar25] = uVar10;
          uVar29 = vmovlps_avx(auVar42);
          auStack_58[uVar25] = uVar29;
          uVar25 = (ulong)((int)uVar25 + 1);
        }
      }
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar230 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar231 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar232 = ZEXT1664(auVar37);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar233 = ZEXT3264(auVar61);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar234 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar235 = ZEXT1664(auVar37);
      auVar236 = ZEXT3264(_DAT_01feed20);
      auVar74._16_16_ = DAT_01feed20._16_16_;
      auVar238 = ZEXT1664(local_328);
      auVar241 = ZEXT1664(local_338);
      if ((int)uVar25 != 0) {
        do {
          auVar47 = auVar230._0_16_;
          auVar49 = auVar239._0_16_;
          auVar48 = auVar237._0_16_;
          uVar24 = (int)uVar25 - 1;
          uVar26 = (ulong)uVar24;
          uVar5 = auStack_188[uVar26];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = auStack_58[uVar26];
          uVar29 = 0;
          for (uVar30 = (ulong)uVar5; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000)
          {
            uVar29 = uVar29 + 1;
          }
          uVar28 = uVar5 - 1 & uVar5;
          bVar35 = uVar28 == 0;
          auStack_188[uVar26] = uVar28;
          if (bVar35) {
            uVar25 = (ulong)uVar24;
          }
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar29;
          auVar37 = vpunpcklqdq_avx(auVar94,ZEXT416((int)uVar29 + 1));
          auVar37 = vcvtqq2ps_avx512vl(auVar37);
          auVar37 = vmulps_avx512vl(auVar37,auVar234._0_16_);
          uVar93 = *(undefined4 *)((long)&uStack_98 + uVar26 * 8 + 4);
          auVar12._4_4_ = uVar93;
          auVar12._0_4_ = uVar93;
          auVar12._8_4_ = uVar93;
          auVar12._12_4_ = uVar93;
          auVar43 = vmulps_avx512vl(auVar37,auVar12);
          auVar39 = auVar235._0_16_;
          auVar37 = vsubps_avx512vl(auVar39,auVar37);
          uVar93 = *(undefined4 *)(&uStack_98 + uVar26);
          auVar13._4_4_ = uVar93;
          auVar13._0_4_ = uVar93;
          auVar13._8_4_ = uVar93;
          auVar13._12_4_ = uVar93;
          auVar37 = vfmadd231ps_avx512vl(auVar43,auVar37,auVar13);
          auVar43 = vmovshdup_avx(auVar37);
          fVar203 = auVar43._0_4_ - auVar37._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar203));
          if (uVar5 == 0 || bVar35) goto LAB_01cf9cc9;
          auVar43 = vshufps_avx(auVar42,auVar42,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar203));
          auVar38 = vsubps_avx512vl(auVar39,auVar43);
          fVar92 = auVar43._0_4_;
          auVar128._0_4_ = fVar92 * (float)local_2c8._0_4_;
          fVar196 = auVar43._4_4_;
          auVar128._4_4_ = fVar196 * (float)local_2c8._4_4_;
          fVar198 = auVar43._8_4_;
          auVar128._8_4_ = fVar198 * fStack_2c0;
          fVar200 = auVar43._12_4_;
          auVar128._12_4_ = fVar200 * fStack_2bc;
          auVar142._0_4_ = fVar92 * (float)local_2d8._0_4_;
          auVar142._4_4_ = fVar196 * (float)local_2d8._4_4_;
          auVar142._8_4_ = fVar198 * fStack_2d0;
          auVar142._12_4_ = fVar200 * fStack_2cc;
          auVar148._0_4_ = fVar92 * (float)local_2e8._0_4_;
          auVar148._4_4_ = fVar196 * (float)local_2e8._4_4_;
          auVar148._8_4_ = fVar198 * fStack_2e0;
          auVar148._12_4_ = fVar200 * fStack_2dc;
          auVar113._0_4_ = fVar92 * (float)local_2f8._0_4_;
          auVar113._4_4_ = fVar196 * (float)local_2f8._4_4_;
          auVar113._8_4_ = fVar198 * fStack_2f0;
          auVar113._12_4_ = fVar200 * fStack_2ec;
          auVar40 = vfmadd231ps_avx512vl(auVar128,auVar38,auVar48);
          auVar41 = vfmadd231ps_avx512vl(auVar142,auVar38,auVar49);
          auVar43 = vfmadd231ps_fma(auVar148,auVar38,local_2a8);
          auVar38 = vfmadd231ps_fma(auVar113,auVar38,local_2b8);
          auVar123._16_16_ = auVar40;
          auVar123._0_16_ = auVar40;
          auVar135._16_16_ = auVar41;
          auVar135._0_16_ = auVar41;
          auVar146._16_16_ = auVar43;
          auVar146._0_16_ = auVar43;
          auVar59 = vpermps_avx512vl(auVar236._0_32_,ZEXT1632(auVar37));
          auVar61 = vsubps_avx(auVar135,auVar123);
          auVar40 = vfmadd213ps_fma(auVar61,auVar59,auVar123);
          auVar61 = vsubps_avx(auVar146,auVar135);
          auVar41 = vfmadd213ps_fma(auVar61,auVar59,auVar135);
          auVar43 = vsubps_avx(auVar38,auVar43);
          auVar136._16_16_ = auVar43;
          auVar136._0_16_ = auVar43;
          auVar43 = vfmadd213ps_fma(auVar136,auVar59,auVar146);
          auVar61 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar40));
          auVar38 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar40));
          auVar61 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar41));
          auVar43 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar41));
          auVar61 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar38));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar61,auVar59);
          auVar61 = vmulps_avx512vl(auVar61,auVar233._0_32_);
          auVar74._16_16_ = auVar61._16_16_;
          fVar92 = fVar203 * 0.33333334;
          auVar149._0_8_ =
               CONCAT44(auVar104._4_4_ + fVar92 * auVar61._4_4_,
                        auVar104._0_4_ + fVar92 * auVar61._0_4_);
          auVar149._8_4_ = auVar104._8_4_ + fVar92 * auVar61._8_4_;
          auVar149._12_4_ = auVar104._12_4_ + fVar92 * auVar61._12_4_;
          auVar129._0_4_ = fVar92 * auVar61._16_4_;
          auVar129._4_4_ = fVar92 * auVar61._20_4_;
          auVar129._8_4_ = fVar92 * auVar61._24_4_;
          auVar129._12_4_ = fVar92 * auVar61._28_4_;
          auVar54 = vsubps_avx((undefined1  [16])0x0,auVar129);
          auVar44 = vshufpd_avx(auVar104,auVar104,3);
          auVar45 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar43 = vsubps_avx(auVar44,auVar104);
          auVar38 = vsubps_avx(auVar45,(undefined1  [16])0x0);
          auVar168._0_4_ = auVar43._0_4_ + auVar38._0_4_;
          auVar168._4_4_ = auVar43._4_4_ + auVar38._4_4_;
          auVar168._8_4_ = auVar43._8_4_ + auVar38._8_4_;
          auVar168._12_4_ = auVar43._12_4_ + auVar38._12_4_;
          auVar43 = vshufps_avx(auVar104,auVar104,0xb1);
          auVar38 = vshufps_avx(auVar149,auVar149,0xb1);
          auVar40 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar41 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar221._4_4_ = auVar168._0_4_;
          auVar221._0_4_ = auVar168._0_4_;
          auVar221._8_4_ = auVar168._0_4_;
          auVar221._12_4_ = auVar168._0_4_;
          auVar46 = vshufps_avx(auVar168,auVar168,0x55);
          fVar92 = auVar46._0_4_;
          auVar179._0_4_ = auVar43._0_4_ * fVar92;
          fVar196 = auVar46._4_4_;
          auVar179._4_4_ = auVar43._4_4_ * fVar196;
          fVar198 = auVar46._8_4_;
          auVar179._8_4_ = auVar43._8_4_ * fVar198;
          fVar200 = auVar46._12_4_;
          auVar179._12_4_ = auVar43._12_4_ * fVar200;
          auVar187._0_4_ = auVar38._0_4_ * fVar92;
          auVar187._4_4_ = auVar38._4_4_ * fVar196;
          auVar187._8_4_ = auVar38._8_4_ * fVar198;
          auVar187._12_4_ = auVar38._12_4_ * fVar200;
          auVar206._0_4_ = auVar40._0_4_ * fVar92;
          auVar206._4_4_ = auVar40._4_4_ * fVar196;
          auVar206._8_4_ = auVar40._8_4_ * fVar198;
          auVar206._12_4_ = auVar40._12_4_ * fVar200;
          auVar169._0_4_ = auVar41._0_4_ * fVar92;
          auVar169._4_4_ = auVar41._4_4_ * fVar196;
          auVar169._8_4_ = auVar41._8_4_ * fVar198;
          auVar169._12_4_ = auVar41._12_4_ * fVar200;
          auVar43 = vfmadd231ps_fma(auVar179,auVar221,auVar104);
          auVar38 = vfmadd231ps_fma(auVar187,auVar221,auVar149);
          auVar53 = vfmadd231ps_fma(auVar206,auVar221,auVar54);
          auVar102 = vfmadd231ps_fma(auVar169,(undefined1  [16])0x0,auVar221);
          auVar46 = vshufpd_avx(auVar43,auVar43,1);
          auVar52 = vshufpd_avx(auVar38,auVar38,1);
          auVar50 = vshufpd_avx512vl(auVar53,auVar53,1);
          auVar51 = vshufpd_avx512vl(auVar102,auVar102,1);
          in_ZMM17 = ZEXT1664(auVar51);
          auVar40 = vminss_avx(auVar43,auVar38);
          auVar43 = vmaxss_avx(auVar38,auVar43);
          auVar41 = vminss_avx(auVar53,auVar102);
          auVar38 = vmaxss_avx(auVar102,auVar53);
          auVar40 = vminss_avx(auVar40,auVar41);
          auVar43 = vmaxss_avx(auVar38,auVar43);
          auVar41 = vminss_avx(auVar46,auVar52);
          auVar38 = vmaxss_avx(auVar52,auVar46);
          auVar46 = vminss_avx512f(auVar50,auVar51);
          auVar52 = vmaxss_avx512f(auVar51,auVar50);
          auVar38 = vmaxss_avx(auVar52,auVar38);
          auVar41 = vminss_avx512f(auVar41,auVar46);
          fVar196 = auVar38._0_4_;
          fVar92 = auVar43._0_4_;
          if (0.0001 <= auVar40._0_4_) {
LAB_01cfa3f3:
            vucomiss_avx512f(auVar41);
            bVar36 = fVar196 <= -0.0001;
            bVar34 = -0.0001 < fVar92;
            bVar33 = bVar36;
            if (!bVar36) goto LAB_01cfa449;
            uVar10 = vcmpps_avx512vl(auVar40,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar11 = vcmpps_avx512vl(auVar41,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar24 = (uint)uVar10 & (uint)uVar11;
            bVar22 = (uVar24 & 1) == 0;
            bVar36 = bVar34 && bVar22;
            bVar33 = bVar34 && (uVar24 & 1) == 0;
            if (bVar34 && bVar22) goto LAB_01cfa449;
          }
          else {
            bVar36 = fVar196 == -0.0001;
            bVar33 = NAN(fVar196);
            if (fVar196 <= -0.0001) goto LAB_01cfa3f3;
LAB_01cfa449:
            auVar52 = vxorps_avx512vl(auVar48,auVar48);
            vcmpss_avx512f(auVar40,auVar52,1);
            uVar10 = vcmpss_avx512f(auVar43,auVar52,1);
            bVar34 = (bool)((byte)uVar10 & 1);
            auVar74._0_16_ = auVar240._0_16_;
            auVar81._4_28_ = auVar74._4_28_;
            auVar81._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * auVar240._0_4_);
            vucomiss_avx512f(auVar81._0_16_);
            bVar33 = (bool)(!bVar36 | bVar33);
            bVar34 = bVar33 == false;
            auVar83._16_16_ = auVar74._16_16_;
            auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar82._4_28_ = auVar83._4_28_;
            auVar82._0_4_ = (uint)bVar33 * auVar52._0_4_ + (uint)!bVar33 * 0x7f800000;
            auVar46 = auVar82._0_16_;
            auVar85._16_16_ = auVar74._16_16_;
            auVar85._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar84._4_28_ = auVar85._4_28_;
            auVar84._0_4_ = (uint)bVar33 * auVar52._0_4_ + (uint)!bVar33 * -0x800000;
            auVar48 = auVar84._0_16_;
            auVar49 = vxorps_avx512vl(auVar49,auVar49);
            uVar10 = vcmpss_avx512f(auVar41,auVar52,1);
            bVar36 = (bool)((byte)uVar10 & 1);
            auVar87._16_16_ = auVar74._16_16_;
            auVar87._0_16_ = auVar240._0_16_;
            auVar86._4_28_ = auVar87._4_28_;
            auVar86._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar240._0_4_);
            vucomiss_avx512f(auVar86._0_16_);
            if ((bVar33) || (bVar34)) {
              auVar41 = vucomiss_avx512f(auVar40);
              if ((bVar33) || (bVar34)) {
                auVar52 = vxorps_avx512vl(auVar40,auVar232._0_16_);
                auVar40 = vsubss_avx512f(auVar41,auVar40);
                auVar40 = vdivss_avx512f(auVar52,auVar40);
                auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar40);
                auVar41 = vfmadd213ss_avx512f(auVar41,auVar49,auVar40);
                auVar40 = auVar41;
              }
              else {
                auVar41 = vxorps_avx512vl(auVar41,auVar41);
                vucomiss_avx512f(auVar41);
                if ((bVar33) || (auVar40 = ZEXT416(0x3f800000), bVar34)) {
                  auVar41 = ZEXT416(0x7f800000);
                  auVar40 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar46 = vminss_avx512f(auVar46,auVar41);
              auVar48 = vmaxss_avx(auVar40,auVar48);
            }
            auVar240 = ZEXT464(0x3f800000);
            in_ZMM17 = ZEXT1664(local_298);
            uVar10 = vcmpss_avx512f(auVar38,auVar49,1);
            bVar36 = (bool)((byte)uVar10 & 1);
            auVar38 = auVar240._0_16_;
            fVar198 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * 0x3f800000);
            if ((auVar81._0_4_ != fVar198) || (NAN(auVar81._0_4_) || NAN(fVar198))) {
              if ((fVar196 != fVar92) || (NAN(fVar196) || NAN(fVar92))) {
                auVar43 = vxorps_avx512vl(auVar43,auVar232._0_16_);
                auVar170._0_4_ = auVar43._0_4_ / (fVar196 - fVar92);
                auVar170._4_12_ = auVar43._4_12_;
                auVar43 = vsubss_avx512f(auVar38,auVar170);
                auVar43 = vfmadd213ss_avx512f(auVar43,auVar49,auVar170);
                auVar40 = auVar43;
              }
              else if ((fVar92 != 0.0) ||
                      (auVar43 = auVar38, auVar40 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar92))) {
                auVar43 = SUB6416(ZEXT464(0xff800000),0);
                auVar40 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar46 = vminss_avx(auVar46,auVar40);
              auVar48 = vmaxss_avx(auVar43,auVar48);
            }
            bVar36 = auVar86._0_4_ != fVar198;
            auVar43 = vminss_avx512f(auVar46,auVar38);
            auVar89._16_16_ = auVar74._16_16_;
            auVar89._0_16_ = auVar46;
            auVar88._4_28_ = auVar89._4_28_;
            auVar88._0_4_ = (uint)bVar36 * auVar43._0_4_ + (uint)!bVar36 * auVar46._0_4_;
            auVar43 = vmaxss_avx512f(auVar38,auVar48);
            auVar91._16_16_ = auVar74._16_16_;
            auVar91._0_16_ = auVar48;
            auVar90._4_28_ = auVar91._4_28_;
            auVar90._0_4_ = (uint)bVar36 * auVar43._0_4_ + (uint)!bVar36 * auVar48._0_4_;
            auVar48 = vmaxss_avx512f(auVar49,auVar88._0_16_);
            auVar43 = vminss_avx512f(auVar90._0_16_,auVar38);
            if (auVar48._0_4_ <= auVar43._0_4_) {
              auVar41 = vmaxss_avx512f(auVar49,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
              auVar53 = vminss_avx512f(ZEXT416((uint)(auVar43._0_4_ + 0.1)),auVar38);
              auVar114._0_8_ = auVar104._0_8_;
              auVar114._8_8_ = auVar114._0_8_;
              auVar188._8_8_ = auVar149._0_8_;
              auVar188._0_8_ = auVar149._0_8_;
              auVar207._8_8_ = auVar54._0_8_;
              auVar207._0_8_ = auVar54._0_8_;
              auVar48 = vshufpd_avx(auVar149,auVar149,3);
              auVar43 = vshufpd_avx(auVar54,auVar54,3);
              auVar40 = vshufps_avx(auVar41,auVar53,0);
              auVar52 = vsubps_avx512vl(auVar39,auVar40);
              fVar92 = auVar40._0_4_;
              auVar143._0_4_ = fVar92 * auVar44._0_4_;
              fVar196 = auVar40._4_4_;
              auVar143._4_4_ = fVar196 * auVar44._4_4_;
              fVar198 = auVar40._8_4_;
              auVar143._8_4_ = fVar198 * auVar44._8_4_;
              fVar200 = auVar40._12_4_;
              auVar143._12_4_ = fVar200 * auVar44._12_4_;
              auVar150._0_4_ = fVar92 * auVar48._0_4_;
              auVar150._4_4_ = fVar196 * auVar48._4_4_;
              auVar150._8_4_ = fVar198 * auVar48._8_4_;
              auVar150._12_4_ = fVar200 * auVar48._12_4_;
              auVar224._0_4_ = auVar43._0_4_ * fVar92;
              auVar224._4_4_ = auVar43._4_4_ * fVar196;
              auVar224._8_4_ = auVar43._8_4_ * fVar198;
              auVar224._12_4_ = auVar43._12_4_ * fVar200;
              auVar130._0_4_ = fVar92 * auVar45._0_4_;
              auVar130._4_4_ = fVar196 * auVar45._4_4_;
              auVar130._8_4_ = fVar198 * auVar45._8_4_;
              auVar130._12_4_ = fVar200 * auVar45._12_4_;
              auVar44 = vfmadd231ps_fma(auVar143,auVar52,auVar114);
              auVar45 = vfmadd231ps_fma(auVar150,auVar52,auVar188);
              auVar46 = vfmadd231ps_fma(auVar224,auVar52,auVar207);
              auVar52 = vfmadd231ps_fma(auVar130,auVar52,ZEXT816(0));
              auVar43 = vsubss_avx512f(auVar38,auVar41);
              auVar48 = vmovshdup_avx(auVar42);
              auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar41._0_4_)),auVar42,
                                         auVar43);
              auVar43 = vsubss_avx512f(auVar38,auVar53);
              auVar104 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar53._0_4_)),auVar42,
                                         auVar43);
              auVar42 = vdivss_avx512f(auVar38,ZEXT416((uint)fVar203));
              auVar48 = vsubps_avx(auVar45,auVar44);
              auVar40 = vmulps_avx512vl(auVar48,auVar47);
              auVar48 = vsubps_avx(auVar46,auVar45);
              auVar41 = vmulps_avx512vl(auVar48,auVar47);
              auVar48 = vsubps_avx(auVar52,auVar46);
              auVar48 = vmulps_avx512vl(auVar48,auVar47);
              auVar43 = vminps_avx(auVar41,auVar48);
              auVar48 = vmaxps_avx(auVar41,auVar48);
              auVar43 = vminps_avx(auVar40,auVar43);
              auVar48 = vmaxps_avx(auVar40,auVar48);
              auVar40 = vshufpd_avx(auVar43,auVar43,3);
              auVar41 = vshufpd_avx(auVar48,auVar48,3);
              auVar43 = vminps_avx(auVar43,auVar40);
              auVar48 = vmaxps_avx(auVar48,auVar41);
              fVar203 = auVar42._0_4_;
              auVar171._0_4_ = auVar43._0_4_ * fVar203;
              auVar171._4_4_ = auVar43._4_4_ * fVar203;
              auVar171._8_4_ = auVar43._8_4_ * fVar203;
              auVar171._12_4_ = auVar43._12_4_ * fVar203;
              auVar159._0_4_ = fVar203 * auVar48._0_4_;
              auVar159._4_4_ = fVar203 * auVar48._4_4_;
              auVar159._8_4_ = fVar203 * auVar48._8_4_;
              auVar159._12_4_ = fVar203 * auVar48._12_4_;
              auVar54 = vdivss_avx512f(auVar38,ZEXT416((uint)(auVar104._0_4_ - auVar102._0_4_)));
              auVar48 = vshufpd_avx(auVar44,auVar44,3);
              auVar43 = vshufpd_avx(auVar45,auVar45,3);
              auVar40 = vshufpd_avx(auVar46,auVar46,3);
              auVar41 = vshufpd_avx(auVar52,auVar52,3);
              auVar48 = vsubps_avx(auVar48,auVar44);
              auVar42 = vsubps_avx(auVar43,auVar45);
              auVar44 = vsubps_avx(auVar40,auVar46);
              auVar41 = vsubps_avx(auVar41,auVar52);
              auVar43 = vminps_avx(auVar48,auVar42);
              auVar48 = vmaxps_avx(auVar48,auVar42);
              auVar40 = vminps_avx(auVar44,auVar41);
              auVar40 = vminps_avx(auVar43,auVar40);
              auVar43 = vmaxps_avx(auVar44,auVar41);
              auVar48 = vmaxps_avx(auVar48,auVar43);
              fVar203 = auVar54._0_4_;
              auVar208._0_4_ = fVar203 * auVar40._0_4_;
              auVar208._4_4_ = fVar203 * auVar40._4_4_;
              auVar208._8_4_ = fVar203 * auVar40._8_4_;
              auVar208._12_4_ = fVar203 * auVar40._12_4_;
              auVar189._0_4_ = fVar203 * auVar48._0_4_;
              auVar189._4_4_ = fVar203 * auVar48._4_4_;
              auVar189._8_4_ = fVar203 * auVar48._8_4_;
              auVar189._12_4_ = fVar203 * auVar48._12_4_;
              auVar41 = vinsertps_avx(auVar37,auVar102,0x10);
              auVar50 = vpermt2ps_avx512vl(auVar37,_DAT_01feecd0,auVar104);
              auVar103._0_4_ = auVar41._0_4_ + auVar50._0_4_;
              auVar103._4_4_ = auVar41._4_4_ + auVar50._4_4_;
              auVar103._8_4_ = auVar41._8_4_ + auVar50._8_4_;
              auVar103._12_4_ = auVar41._12_4_ + auVar50._12_4_;
              auVar14._8_4_ = 0x3f000000;
              auVar14._0_8_ = 0x3f0000003f000000;
              auVar14._12_4_ = 0x3f000000;
              auVar52 = vmulps_avx512vl(auVar103,auVar14);
              auVar43 = vshufps_avx(auVar52,auVar52,0x54);
              uVar93 = auVar52._0_4_;
              auVar106._4_4_ = uVar93;
              auVar106._0_4_ = uVar93;
              auVar106._8_4_ = uVar93;
              auVar106._12_4_ = uVar93;
              auVar42 = vfmadd213ps_avx512vl(auVar238._0_16_,auVar106,local_288);
              auVar44 = vfmadd213ps_avx512vl(auVar241._0_16_,auVar106,local_298);
              auVar40 = vfmadd213ps_fma(local_108,auVar106,local_198);
              auVar48 = vsubps_avx(auVar44,auVar42);
              auVar42 = vfmadd213ps_fma(auVar48,auVar106,auVar42);
              auVar48 = vsubps_avx(auVar40,auVar44);
              auVar48 = vfmadd213ps_fma(auVar48,auVar106,auVar44);
              auVar48 = vsubps_avx(auVar48,auVar42);
              auVar40 = vfmadd231ps_fma(auVar42,auVar48,auVar106);
              auVar45 = vmulps_avx512vl(auVar48,auVar47);
              auVar215._8_8_ = auVar40._0_8_;
              auVar215._0_8_ = auVar40._0_8_;
              auVar48 = vshufpd_avx(auVar40,auVar40,3);
              auVar40 = vshufps_avx(auVar52,auVar52,0x55);
              auVar42 = vsubps_avx(auVar48,auVar215);
              auVar44 = vfmadd231ps_fma(auVar215,auVar40,auVar42);
              auVar225._8_8_ = auVar45._0_8_;
              auVar225._0_8_ = auVar45._0_8_;
              auVar48 = vshufpd_avx(auVar45,auVar45,3);
              auVar48 = vsubps_avx512vl(auVar48,auVar225);
              auVar48 = vfmadd213ps_avx512vl(auVar48,auVar40,auVar225);
              auVar107._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
              auVar107._8_4_ = auVar42._8_4_ ^ 0x80000000;
              auVar107._12_4_ = auVar42._12_4_ ^ 0x80000000;
              auVar40 = vmovshdup_avx512vl(auVar48);
              auVar226._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar40._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar40._12_4_ ^ 0x80000000;
              auVar45 = vmovshdup_avx512vl(auVar42);
              auVar46 = vpermt2ps_avx512vl(auVar226,ZEXT416(5),auVar42);
              auVar40 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar42._0_4_)),auVar48,
                                            auVar45);
              auVar42 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar107);
              auVar131._0_4_ = auVar40._0_4_;
              auVar131._4_4_ = auVar131._0_4_;
              auVar131._8_4_ = auVar131._0_4_;
              auVar131._12_4_ = auVar131._0_4_;
              auVar48 = vdivps_avx(auVar46,auVar131);
              auVar51 = vdivps_avx512vl(auVar42,auVar131);
              fVar203 = auVar44._0_4_;
              auVar40 = vshufps_avx(auVar44,auVar44,0x55);
              auVar216._0_4_ = fVar203 * auVar48._0_4_ + auVar40._0_4_ * auVar51._0_4_;
              auVar216._4_4_ = fVar203 * auVar48._4_4_ + auVar40._4_4_ * auVar51._4_4_;
              auVar216._8_4_ = fVar203 * auVar48._8_4_ + auVar40._8_4_ * auVar51._8_4_;
              auVar216._12_4_ = fVar203 * auVar48._12_4_ + auVar40._12_4_ * auVar51._12_4_;
              auVar54 = vsubps_avx(auVar43,auVar216);
              auVar40 = vmovshdup_avx(auVar48);
              auVar43 = vinsertps_avx(auVar171,auVar208,0x1c);
              auVar227._0_4_ = auVar40._0_4_ * auVar43._0_4_;
              auVar227._4_4_ = auVar40._4_4_ * auVar43._4_4_;
              auVar227._8_4_ = auVar40._8_4_ * auVar43._8_4_;
              auVar227._12_4_ = auVar40._12_4_ * auVar43._12_4_;
              auVar53 = vinsertps_avx512f(auVar159,auVar189,0x1c);
              auVar40 = vmulps_avx512vl(auVar40,auVar53);
              auVar46 = vminps_avx512vl(auVar227,auVar40);
              auVar44 = vmaxps_avx(auVar40,auVar227);
              auVar45 = vmovshdup_avx(auVar51);
              auVar40 = vinsertps_avx(auVar208,auVar171,0x4c);
              auVar209._0_4_ = auVar45._0_4_ * auVar40._0_4_;
              auVar209._4_4_ = auVar45._4_4_ * auVar40._4_4_;
              auVar209._8_4_ = auVar45._8_4_ * auVar40._8_4_;
              auVar209._12_4_ = auVar45._12_4_ * auVar40._12_4_;
              auVar42 = vinsertps_avx(auVar189,auVar159,0x4c);
              auVar190._0_4_ = auVar45._0_4_ * auVar42._0_4_;
              auVar190._4_4_ = auVar45._4_4_ * auVar42._4_4_;
              auVar190._8_4_ = auVar45._8_4_ * auVar42._8_4_;
              auVar190._12_4_ = auVar45._12_4_ * auVar42._12_4_;
              auVar45 = vminps_avx(auVar209,auVar190);
              auVar46 = vaddps_avx512vl(auVar46,auVar45);
              auVar45 = vmaxps_avx(auVar190,auVar209);
              auVar191._0_4_ = auVar44._0_4_ + auVar45._0_4_;
              auVar191._4_4_ = auVar44._4_4_ + auVar45._4_4_;
              auVar191._8_4_ = auVar44._8_4_ + auVar45._8_4_;
              auVar191._12_4_ = auVar44._12_4_ + auVar45._12_4_;
              auVar210._8_8_ = 0x3f80000000000000;
              auVar210._0_8_ = 0x3f80000000000000;
              auVar44 = vsubps_avx(auVar210,auVar191);
              auVar45 = vsubps_avx(auVar210,auVar46);
              auVar46 = vsubps_avx(auVar41,auVar52);
              auVar52 = vsubps_avx(auVar50,auVar52);
              fVar200 = auVar46._0_4_;
              auVar228._0_4_ = fVar200 * auVar44._0_4_;
              fVar201 = auVar46._4_4_;
              auVar228._4_4_ = fVar201 * auVar44._4_4_;
              fVar202 = auVar46._8_4_;
              auVar228._8_4_ = fVar202 * auVar44._8_4_;
              fVar101 = auVar46._12_4_;
              auVar228._12_4_ = fVar101 * auVar44._12_4_;
              auVar55 = vbroadcastss_avx512vl(auVar48);
              auVar43 = vmulps_avx512vl(auVar55,auVar43);
              auVar53 = vmulps_avx512vl(auVar55,auVar53);
              auVar55 = vminps_avx512vl(auVar43,auVar53);
              auVar53 = vmaxps_avx512vl(auVar53,auVar43);
              auVar43 = vbroadcastss_avx512vl(auVar51);
              auVar40 = vmulps_avx512vl(auVar43,auVar40);
              auVar43 = vmulps_avx512vl(auVar43,auVar42);
              auVar42 = vminps_avx512vl(auVar40,auVar43);
              auVar42 = vaddps_avx512vl(auVar55,auVar42);
              auVar46 = vmulps_avx512vl(auVar46,auVar45);
              in_ZMM17 = ZEXT1664(auVar46);
              fVar203 = auVar52._0_4_;
              auVar192._0_4_ = fVar203 * auVar44._0_4_;
              fVar92 = auVar52._4_4_;
              auVar192._4_4_ = fVar92 * auVar44._4_4_;
              fVar196 = auVar52._8_4_;
              auVar192._8_4_ = fVar196 * auVar44._8_4_;
              fVar198 = auVar52._12_4_;
              auVar192._12_4_ = fVar198 * auVar44._12_4_;
              auVar211._0_4_ = fVar203 * auVar45._0_4_;
              auVar211._4_4_ = fVar92 * auVar45._4_4_;
              auVar211._8_4_ = fVar196 * auVar45._8_4_;
              auVar211._12_4_ = fVar198 * auVar45._12_4_;
              auVar43 = vmaxps_avx(auVar43,auVar40);
              auVar160._0_4_ = auVar53._0_4_ + auVar43._0_4_;
              auVar160._4_4_ = auVar53._4_4_ + auVar43._4_4_;
              auVar160._8_4_ = auVar53._8_4_ + auVar43._8_4_;
              auVar160._12_4_ = auVar53._12_4_ + auVar43._12_4_;
              auVar172._8_8_ = 0x3f800000;
              auVar172._0_8_ = 0x3f800000;
              auVar43 = vsubps_avx(auVar172,auVar160);
              auVar40 = vsubps_avx512vl(auVar172,auVar42);
              auVar222._0_4_ = fVar200 * auVar43._0_4_;
              auVar222._4_4_ = fVar201 * auVar43._4_4_;
              auVar222._8_4_ = fVar202 * auVar43._8_4_;
              auVar222._12_4_ = fVar101 * auVar43._12_4_;
              auVar217._0_4_ = fVar200 * auVar40._0_4_;
              auVar217._4_4_ = fVar201 * auVar40._4_4_;
              auVar217._8_4_ = fVar202 * auVar40._8_4_;
              auVar217._12_4_ = fVar101 * auVar40._12_4_;
              auVar161._0_4_ = fVar203 * auVar43._0_4_;
              auVar161._4_4_ = fVar92 * auVar43._4_4_;
              auVar161._8_4_ = fVar196 * auVar43._8_4_;
              auVar161._12_4_ = fVar198 * auVar43._12_4_;
              auVar173._0_4_ = fVar203 * auVar40._0_4_;
              auVar173._4_4_ = fVar92 * auVar40._4_4_;
              auVar173._8_4_ = fVar196 * auVar40._8_4_;
              auVar173._12_4_ = fVar198 * auVar40._12_4_;
              auVar43 = vminps_avx(auVar222,auVar217);
              auVar40 = vminps_avx512vl(auVar161,auVar173);
              auVar42 = vminps_avx512vl(auVar43,auVar40);
              auVar43 = vmaxps_avx(auVar217,auVar222);
              auVar40 = vmaxps_avx(auVar173,auVar161);
              auVar40 = vmaxps_avx(auVar40,auVar43);
              auVar44 = vminps_avx512vl(auVar228,auVar46);
              auVar43 = vminps_avx(auVar192,auVar211);
              auVar43 = vminps_avx(auVar44,auVar43);
              auVar43 = vhaddps_avx(auVar42,auVar43);
              auVar44 = vmaxps_avx512vl(auVar46,auVar228);
              auVar42 = vmaxps_avx(auVar211,auVar192);
              auVar42 = vmaxps_avx(auVar42,auVar44);
              auVar40 = vhaddps_avx(auVar40,auVar42);
              auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
              auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
              auVar162._0_4_ = auVar43._0_4_ + auVar54._0_4_;
              auVar162._4_4_ = auVar43._4_4_ + auVar54._4_4_;
              auVar162._8_4_ = auVar43._8_4_ + auVar54._8_4_;
              auVar162._12_4_ = auVar43._12_4_ + auVar54._12_4_;
              auVar174._0_4_ = auVar40._0_4_ + auVar54._0_4_;
              auVar174._4_4_ = auVar40._4_4_ + auVar54._4_4_;
              auVar174._8_4_ = auVar40._8_4_ + auVar54._8_4_;
              auVar174._12_4_ = auVar40._12_4_ + auVar54._12_4_;
              auVar43 = vmaxps_avx(auVar41,auVar162);
              auVar40 = vminps_avx(auVar174,auVar50);
              uVar29 = vcmpps_avx512vl(auVar40,auVar43,1);
              if ((uVar29 & 3) == 0) {
                uVar29 = vcmpps_avx512vl(auVar174,auVar50,1);
                uVar10 = vcmpps_avx512vl(auVar37,auVar162,1);
                if (((ushort)uVar10 & (ushort)uVar29 & 1) == 0) {
                  bVar23 = 0;
                }
                else {
                  auVar43 = vmovshdup_avx(auVar162);
                  bVar23 = auVar102._0_4_ < auVar43._0_4_ & (byte)(uVar29 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar25 || uVar5 != 0 && !bVar35) | bVar23) != 1) {
                  auVar42 = vinsertps_avx(auVar102,auVar104,0x10);
                  auVar237 = ZEXT1664(local_1a8);
                  auVar239 = ZEXT1664(local_1b8);
                  goto LAB_01cf9cc9;
                }
                lVar27 = 200;
                do {
                  auVar37 = vsubss_avx512f(auVar38,auVar54);
                  fVar196 = auVar37._0_4_;
                  fVar203 = fVar196 * fVar196 * fVar196;
                  auVar37 = vmulss_avx512f(auVar54,ZEXT416(0x40400000));
                  fVar92 = auVar37._0_4_ * fVar196 * fVar196;
                  fVar198 = auVar54._0_4_;
                  auVar37 = vmulss_avx512f(ZEXT416((uint)(fVar198 * fVar198)),ZEXT416(0x40400000));
                  fVar196 = fVar196 * auVar37._0_4_;
                  auVar120._4_4_ = fVar203;
                  auVar120._0_4_ = fVar203;
                  auVar120._8_4_ = fVar203;
                  auVar120._12_4_ = fVar203;
                  auVar115._4_4_ = fVar92;
                  auVar115._0_4_ = fVar92;
                  auVar115._8_4_ = fVar92;
                  auVar115._12_4_ = fVar92;
                  auVar95._4_4_ = fVar196;
                  auVar95._0_4_ = fVar196;
                  auVar95._8_4_ = fVar196;
                  auVar95._12_4_ = fVar196;
                  fVar198 = fVar198 * fVar198 * fVar198;
                  auVar144._0_4_ = (float)local_f8._0_4_ * fVar198;
                  auVar144._4_4_ = (float)local_f8._4_4_ * fVar198;
                  auVar144._8_4_ = fStack_f0 * fVar198;
                  auVar144._12_4_ = fStack_ec * fVar198;
                  auVar37 = vfmadd231ps_fma(auVar144,local_198,auVar95);
                  auVar37 = vfmadd231ps_fma(auVar37,local_298,auVar115);
                  auVar37 = vfmadd231ps_fma(auVar37,local_288,auVar120);
                  auVar96._8_8_ = auVar37._0_8_;
                  auVar96._0_8_ = auVar37._0_8_;
                  auVar37 = vshufpd_avx(auVar37,auVar37,3);
                  auVar43 = vshufps_avx(auVar54,auVar54,0x55);
                  auVar37 = vsubps_avx(auVar37,auVar96);
                  auVar43 = vfmadd213ps_fma(auVar37,auVar43,auVar96);
                  fVar203 = auVar43._0_4_;
                  auVar37 = vshufps_avx(auVar43,auVar43,0x55);
                  auVar97._0_4_ = auVar48._0_4_ * fVar203 + auVar51._0_4_ * auVar37._0_4_;
                  auVar97._4_4_ = auVar48._4_4_ * fVar203 + auVar51._4_4_ * auVar37._4_4_;
                  auVar97._8_4_ = auVar48._8_4_ * fVar203 + auVar51._8_4_ * auVar37._8_4_;
                  auVar97._12_4_ = auVar48._12_4_ * fVar203 + auVar51._12_4_ * auVar37._12_4_;
                  auVar54 = vsubps_avx(auVar54,auVar97);
                  auVar37 = vandps_avx512vl(auVar43,auVar231._0_16_);
                  auVar43 = vprolq_avx512vl(auVar37,0x20);
                  auVar37 = vmaxss_avx(auVar43,auVar37);
                  bVar35 = auVar37._0_4_ <= (float)local_e8._0_4_;
                  if (auVar37._0_4_ < (float)local_e8._0_4_) {
                    auVar37 = vucomiss_avx512f(auVar49);
                    if (bVar35) {
                      auVar48 = vucomiss_avx512f(auVar37);
                      auVar240 = ZEXT1664(auVar48);
                      if (bVar35) {
                        vmovshdup_avx(auVar37);
                        auVar48 = vucomiss_avx512f(auVar49);
                        if (bVar35) {
                          auVar49 = vucomiss_avx512f(auVar48);
                          auVar240 = ZEXT1664(auVar49);
                          if (bVar35) {
                            auVar43 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar46 = vinsertps_avx(auVar43,ZEXT416((uint)(pre->ray_space).vz.
                                                                          field_0.m128[2]),0x28);
                            aVar1 = (ray->super_RayK<1>).org.field_0;
                            auVar43 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
                            auVar43 = vdpps_avx(auVar43,auVar46,0x7f);
                            auVar38 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                            auVar38 = vdpps_avx(auVar38,auVar46,0x7f);
                            auVar40 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                            auVar40 = vdpps_avx(auVar40,auVar46,0x7f);
                            auVar41 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
                            auVar41 = vdpps_avx(auVar41,auVar46,0x7f);
                            auVar42 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
                            auVar42 = vdpps_avx(auVar42,auVar46,0x7f);
                            auVar44 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                            auVar44 = vdpps_avx(auVar44,auVar46,0x7f);
                            auVar45 = vsubps_avx(_local_238,(undefined1  [16])aVar1);
                            auVar45 = vdpps_avx(auVar45,auVar46,0x7f);
                            auVar52 = vsubps_avx(_local_1f8,(undefined1  [16])aVar1);
                            auVar46 = vdpps_avx(auVar52,auVar46,0x7f);
                            auVar52 = vsubss_avx512f(auVar49,auVar48);
                            fVar203 = auVar48._0_4_;
                            auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar203)),
                                                      auVar52,auVar43);
                            auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar203)),
                                                      auVar52,auVar38);
                            auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar203)),
                                                      auVar52,auVar40);
                            auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar46._0_4_)),
                                                      auVar52,auVar41);
                            auVar49 = vsubss_avx512f(auVar49,auVar37);
                            auVar145._0_4_ = auVar49._0_4_;
                            fVar92 = auVar145._0_4_ * auVar145._0_4_ * auVar145._0_4_;
                            auVar49 = vmulss_avx512f(auVar37,ZEXT416(0x40400000));
                            fVar196 = auVar49._0_4_ * auVar145._0_4_ * auVar145._0_4_;
                            fVar203 = auVar37._0_4_;
                            auVar132._0_4_ = fVar203 * fVar203;
                            auVar132._4_4_ = auVar37._4_4_ * auVar37._4_4_;
                            auVar132._8_4_ = auVar37._8_4_ * auVar37._8_4_;
                            auVar132._12_4_ = auVar37._12_4_ * auVar37._12_4_;
                            auVar49 = vmulss_avx512f(auVar132,ZEXT416(0x40400000));
                            fVar198 = auVar145._0_4_ * auVar49._0_4_;
                            fVar201 = fVar203 * auVar132._0_4_;
                            auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar40._0_4_)),
                                                      ZEXT416((uint)fVar198),auVar38);
                            auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar196),auVar43);
                            auVar48 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar92),auVar48);
                            fVar200 = auVar48._0_4_;
                            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar200) &&
                               (local_33c = (ray->super_RayK<1>).tfar, fVar200 <= local_33c)) {
                              auVar48 = vshufps_avx(auVar37,auVar37,0x55);
                              auVar39 = vsubps_avx512vl(auVar39,auVar48);
                              fVar202 = auVar48._0_4_;
                              auVar175._0_4_ = fVar202 * (float)local_1d8._0_4_;
                              fVar101 = auVar48._4_4_;
                              auVar175._4_4_ = fVar101 * (float)local_1d8._4_4_;
                              fVar112 = auVar48._8_4_;
                              auVar175._8_4_ = fVar112 * fStack_1d0;
                              fVar98 = auVar48._12_4_;
                              auVar175._12_4_ = fVar98 * fStack_1cc;
                              auVar180._0_4_ = fVar202 * (float)local_228._0_4_;
                              auVar180._4_4_ = fVar101 * (float)local_228._4_4_;
                              auVar180._8_4_ = fVar112 * fStack_220;
                              auVar180._12_4_ = fVar98 * fStack_21c;
                              auVar193._0_4_ = fVar202 * (float)local_238._0_4_;
                              auVar193._4_4_ = fVar101 * (float)local_238._4_4_;
                              auVar193._8_4_ = fVar112 * fStack_230;
                              auVar193._12_4_ = fVar98 * fStack_22c;
                              auVar151._0_4_ = fVar202 * (float)local_1f8._0_4_;
                              auVar151._4_4_ = fVar101 * (float)local_1f8._4_4_;
                              auVar151._8_4_ = fVar112 * fStack_1f0;
                              auVar151._12_4_ = fVar98 * fStack_1ec;
                              auVar48 = vfmadd231ps_fma(auVar175,auVar39,local_1c8);
                              auVar49 = vfmadd231ps_fma(auVar180,auVar39,local_208);
                              auVar43 = vfmadd231ps_fma(auVar193,auVar39,local_218);
                              auVar39 = vfmadd231ps_fma(auVar151,auVar39,local_1e8);
                              auVar48 = vsubps_avx(auVar49,auVar48);
                              auVar49 = vsubps_avx(auVar43,auVar49);
                              auVar43 = vsubps_avx(auVar39,auVar43);
                              auVar194._0_4_ = fVar203 * auVar49._0_4_;
                              auVar194._4_4_ = fVar203 * auVar49._4_4_;
                              auVar194._8_4_ = fVar203 * auVar49._8_4_;
                              auVar194._12_4_ = fVar203 * auVar49._12_4_;
                              auVar145._4_4_ = auVar145._0_4_;
                              auVar145._8_4_ = auVar145._0_4_;
                              auVar145._12_4_ = auVar145._0_4_;
                              auVar48 = vfmadd231ps_fma(auVar194,auVar145,auVar48);
                              auVar152._0_4_ = fVar203 * auVar43._0_4_;
                              auVar152._4_4_ = fVar203 * auVar43._4_4_;
                              auVar152._8_4_ = fVar203 * auVar43._8_4_;
                              auVar152._12_4_ = fVar203 * auVar43._12_4_;
                              auVar49 = vfmadd231ps_fma(auVar152,auVar145,auVar49);
                              auVar153._0_4_ = fVar203 * auVar49._0_4_;
                              auVar153._4_4_ = fVar203 * auVar49._4_4_;
                              auVar153._8_4_ = fVar203 * auVar49._8_4_;
                              auVar153._12_4_ = fVar203 * auVar49._12_4_;
                              auVar48 = vfmadd231ps_fma(auVar153,auVar145,auVar48);
                              auVar47 = vmulps_avx512vl(auVar48,auVar47);
                              pGVar6 = (context->scene->geometries).items[uVar31].ptr;
                              if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                                auVar133._0_4_ = fVar201 * (float)local_148._0_4_;
                                auVar133._4_4_ = fVar201 * (float)local_148._4_4_;
                                auVar133._8_4_ = fVar201 * fStack_140;
                                auVar133._12_4_ = fVar201 * fStack_13c;
                                auVar121._4_4_ = fVar198;
                                auVar121._0_4_ = fVar198;
                                auVar121._8_4_ = fVar198;
                                auVar121._12_4_ = fVar198;
                                auVar48 = vfmadd132ps_fma(auVar121,auVar133,local_138);
                                auVar116._4_4_ = fVar196;
                                auVar116._0_4_ = fVar196;
                                auVar116._8_4_ = fVar196;
                                auVar116._12_4_ = fVar196;
                                auVar48 = vfmadd132ps_fma(auVar116,auVar48,local_128);
                                auVar108._4_4_ = fVar92;
                                auVar108._0_4_ = fVar92;
                                auVar108._8_4_ = fVar92;
                                auVar108._12_4_ = fVar92;
                                auVar43 = vfmadd132ps_fma(auVar108,auVar48,local_118);
                                auVar48 = vshufps_avx(auVar43,auVar43,0xc9);
                                auVar49 = vshufps_avx(auVar47,auVar47,0xc9);
                                auVar109._0_4_ = auVar43._0_4_ * auVar49._0_4_;
                                auVar109._4_4_ = auVar43._4_4_ * auVar49._4_4_;
                                auVar109._8_4_ = auVar43._8_4_ * auVar49._8_4_;
                                auVar109._12_4_ = auVar43._12_4_ * auVar49._12_4_;
                                auVar47 = vfmsub231ps_fma(auVar109,auVar47,auVar48);
                                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                  (ray->super_RayK<1>).tfar = fVar200;
                                  auVar48 = vshufps_avx(auVar47,auVar47,0xe9);
                                  uVar10 = vmovlps_avx(auVar48);
                                  *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                                  (ray->Ng).field_0.field_0.z = auVar47._0_4_;
                                  uVar10 = vmovlps_avx(auVar37);
                                  ray->u = (float)(int)uVar10;
                                  ray->v = (float)(int)((ulong)uVar10 >> 0x20);
                                  ray->primID = (uint)local_300;
                                  ray->geomID = uVar31;
                                  ray->instID[0] = context->user->instID[0];
                                  ray->instPrimID[0] = context->user->instPrimID[0];
                                }
                                else {
                                  auVar48 = vshufps_avx(auVar47,auVar47,0xe9);
                                  local_178 = vmovlps_avx(auVar48);
                                  local_170 = auVar47._0_4_;
                                  local_16c = vmovlps_avx(auVar37);
                                  local_164 = (uint)local_300;
                                  local_160 = uVar31;
                                  local_15c = context->user->instID[0];
                                  local_158 = context->user->instPrimID[0];
                                  (ray->super_RayK<1>).tfar = fVar200;
                                  local_340 = -1;
                                  local_268.valid = &local_340;
                                  local_268.geometryUserPtr = pGVar6->userPtr;
                                  local_268.context = context->user;
                                  local_268.ray = (RTCRayN *)ray;
                                  local_268.hit = (RTCHitN *)&local_178;
                                  local_268.N = 1;
                                  if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01cfaf57:
                                    p_Var9 = context->args->filter;
                                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var9)(&local_268);
                                      auVar241 = ZEXT1664(local_338);
                                      auVar238 = ZEXT1664(local_328);
                                      auVar240 = ZEXT464(0x3f800000);
                                      auVar236 = ZEXT3264(_DAT_01feed20);
                                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar235 = ZEXT1664(auVar37);
                                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar234 = ZEXT1664(auVar37);
                                      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar233 = ZEXT3264(auVar61);
                                      auVar74._16_16_ = auVar61._16_16_;
                                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar232 = ZEXT1664(auVar37);
                                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar231 = ZEXT1664(auVar37);
                                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar230 = ZEXT1664(auVar37);
                                      if (*local_268.valid == 0) goto LAB_01cfb079;
                                    }
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).components[0]
                                         = *(float *)local_268.hit;
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).field_0.y =
                                         *(float *)(local_268.hit + 4);
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).field_0.z =
                                         *(float *)(local_268.hit + 8);
                                    *(float *)((long)local_268.ray + 0x3c) =
                                         *(float *)(local_268.hit + 0xc);
                                    *(float *)((long)local_268.ray + 0x40) =
                                         *(float *)(local_268.hit + 0x10);
                                    *(float *)((long)local_268.ray + 0x44) =
                                         *(float *)(local_268.hit + 0x14);
                                    *(float *)((long)local_268.ray + 0x48) =
                                         *(float *)(local_268.hit + 0x18);
                                    *(float *)((long)local_268.ray + 0x4c) =
                                         *(float *)(local_268.hit + 0x1c);
                                    *(float *)((long)local_268.ray + 0x50) =
                                         *(float *)(local_268.hit + 0x20);
                                  }
                                  else {
                                    local_270 = context;
                                    (*pGVar6->intersectionFilterN)(&local_268);
                                    auVar241 = ZEXT1664(local_338);
                                    auVar238 = ZEXT1664(local_328);
                                    auVar240 = ZEXT464(0x3f800000);
                                    auVar236 = ZEXT3264(_DAT_01feed20);
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar235 = ZEXT1664(auVar37);
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar234 = ZEXT1664(auVar37);
                                    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar233 = ZEXT3264(auVar61);
                                    auVar74._16_16_ = auVar61._16_16_;
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar232 = ZEXT1664(auVar37);
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar231 = ZEXT1664(auVar37);
                                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar230 = ZEXT1664(auVar37);
                                    context = local_270;
                                    if (*local_268.valid != 0) goto LAB_01cfaf57;
LAB_01cfb079:
                                    auVar240 = ZEXT464(0x3f800000);
                                    (ray->super_RayK<1>).tfar = local_33c;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar27 = lVar27 + -1;
                } while (lVar27 != 0);
              }
            }
          }
          auVar237 = ZEXT1664(local_1a8);
          auVar239 = ZEXT1664(local_1b8);
          if ((uint)uVar25 == 0) break;
        } while( true );
      }
      fVar203 = (ray->super_RayK<1>).tfar;
      auVar15._4_4_ = fVar203;
      auVar15._0_4_ = fVar203;
      auVar15._8_4_ = fVar203;
      auVar15._12_4_ = fVar203;
      auVar15._16_4_ = fVar203;
      auVar15._20_4_ = fVar203;
      auVar15._24_4_ = fVar203;
      auVar15._28_4_ = fVar203;
      uVar10 = vcmpps_avx512vl(local_78,auVar15,2);
      uVar31 = (uint)uVar32 & (uint)local_310 & (uint)uVar10;
      uVar32 = (ulong)uVar31;
      prim = local_308;
    } while (uVar31 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }